

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  bool bVar57;
  ulong uVar58;
  Geometry *geometry;
  long lVar59;
  byte bVar60;
  float fVar61;
  float fVar122;
  float fVar124;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar62;
  float fVar123;
  float fVar125;
  float fVar127;
  float fVar128;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar126;
  float fVar129;
  float fVar130;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined4 uVar131;
  vint4 bi_2;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined8 uVar135;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar143;
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar162;
  vint4 ai_1;
  undefined1 auVar161 [16];
  vint4 ai_2;
  undefined1 auVar163 [32];
  float fVar165;
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  int local_55c;
  RayQueryContext *local_558;
  long local_550;
  Primitive *local_548;
  Ray *local_540;
  ulong local_538;
  Precalculations *local_530;
  float local_524;
  undefined1 local_520 [32];
  RTCFilterFunctionNArguments local_4f0;
  undefined8 local_4c0;
  undefined4 local_4b8;
  float local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  uint local_4a4;
  uint local_4a0;
  Geometry *local_490;
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  ulong local_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_2f0 [8];
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar54 = (ulong)(byte)prim[1];
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  lVar56 = uVar54 * 0x25;
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xf + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x11 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1a + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1b + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1c + 6)));
  fVar160 = *(float *)(prim + lVar56 + 0x12);
  auVar178._4_4_ = fVar160;
  auVar178._0_4_ = fVar160;
  auVar178._8_4_ = fVar160;
  auVar178._12_4_ = fVar160;
  auVar63 = vsubps_avx512vl((undefined1  [16])(ray->org).field_0,
                            *(undefined1 (*) [16])(prim + lVar56 + 6));
  fVar143 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar56 + 0x16)) *
            *(float *)(prim + lVar56 + 0x1a);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar76);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar54 * 0xb + 6);
  auVar84 = vpmovsxwd_avx(auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar133 = vpmovsxwd_avx(auVar82);
  auVar64 = vpbroadcastd_avx512vl();
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar54 * 0xd + 6);
  auVar65 = vpmovsxwd_avx512vl(auVar77);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar54 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar63 = vmulps_avx512vl(auVar178,auVar63);
  auVar179._0_4_ = fVar160 * (ray->dir).field_0.m128[0];
  auVar179._4_4_ = fVar160 * (ray->dir).field_0.m128[1];
  auVar179._8_4_ = fVar160 * (ray->dir).field_0.m128[2];
  auVar179._12_4_ = fVar160 * (ray->dir).field_0.m128[3];
  auVar66 = vcvtdq2ps_avx512vl(auVar19);
  auVar67 = vcvtdq2ps_avx512vl(auVar72);
  auVar68 = vcvtdq2ps_avx512vl(auVar68);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar76 = vcvtdq2ps_avx(auVar71);
  auVar81 = vcvtdq2ps_avx(auVar73);
  auVar82 = vcvtdq2ps_avx(auVar74);
  auVar77 = vcvtdq2ps_avx(auVar75);
  auVar168._4_4_ = auVar179._0_4_;
  auVar168._0_4_ = auVar179._0_4_;
  auVar168._8_4_ = auVar179._0_4_;
  auVar168._12_4_ = auVar179._0_4_;
  auVar19 = vshufps_avx(auVar179,auVar179,0x55);
  auVar72 = vshufps_avx(auVar179,auVar179,0xaa);
  auVar71 = vmulps_avx512vl(auVar72,auVar68);
  auVar136._0_4_ = auVar72._0_4_ * auVar76._0_4_;
  auVar136._4_4_ = auVar72._4_4_ * auVar76._4_4_;
  auVar136._8_4_ = auVar72._8_4_ * auVar76._8_4_;
  auVar136._12_4_ = auVar72._12_4_ * auVar76._12_4_;
  auVar132._0_4_ = auVar77._0_4_ * auVar72._0_4_;
  auVar132._4_4_ = auVar77._4_4_ * auVar72._4_4_;
  auVar132._8_4_ = auVar77._8_4_ * auVar72._8_4_;
  auVar132._12_4_ = auVar77._12_4_ * auVar72._12_4_;
  auVar72 = vfmadd231ps_avx512vl(auVar71,auVar19,auVar67);
  auVar71 = vfmadd231ps_avx512vl(auVar136,auVar19,auVar70);
  auVar19 = vfmadd231ps_fma(auVar132,auVar82,auVar19);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar168,auVar66);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar168,auVar69);
  auVar19 = vfmadd231ps_fma(auVar19,auVar81,auVar168);
  auVar73 = vbroadcastss_avx512vl(auVar63);
  auVar74 = vshufps_avx512vl(auVar63,auVar63,0x55);
  auVar75 = vshufps_avx512vl(auVar63,auVar63,0xaa);
  auVar68 = vmulps_avx512vl(auVar75,auVar68);
  auVar76 = vmulps_avx512vl(auVar75,auVar76);
  auVar77 = vmulps_avx512vl(auVar75,auVar77);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar67);
  auVar70 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar70);
  auVar76 = vfmadd231ps_fma(auVar77,auVar74,auVar82);
  auVar66 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar66);
  auVar67 = vfmadd231ps_avx512vl(auVar70,auVar73,auVar69);
  auVar63 = vfmadd231ps_fma(auVar76,auVar73,auVar81);
  auVar175._8_4_ = 0x7fffffff;
  auVar175._0_8_ = 0x7fffffff7fffffff;
  auVar175._12_4_ = 0x7fffffff;
  auVar76 = vandps_avx(auVar175,auVar72);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  uVar58 = vcmpps_avx512vl(auVar76,auVar172,1);
  bVar57 = (bool)((byte)uVar58 & 1);
  auVar78._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar72._0_4_;
  bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar72._4_4_;
  bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar72._8_4_;
  bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar72._12_4_;
  auVar76 = vandps_avx(auVar175,auVar71);
  uVar58 = vcmpps_avx512vl(auVar76,auVar172,1);
  bVar57 = (bool)((byte)uVar58 & 1);
  auVar79._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._0_4_;
  bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._4_4_;
  bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._8_4_;
  bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._12_4_;
  auVar76 = vandps_avx(auVar175,auVar19);
  uVar58 = vcmpps_avx512vl(auVar76,auVar172,1);
  bVar57 = (bool)((byte)uVar58 & 1);
  auVar80._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar19._0_4_;
  bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar19._4_4_;
  bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar19._8_4_;
  bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar19._12_4_;
  auVar81 = vrcp14ps_avx512vl(auVar78);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = 0x3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar78,auVar81,auVar173);
  auVar77 = vfmadd132ps_fma(auVar76,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar76 = vfnmadd213ps_fma(auVar79,auVar81,auVar173);
  auVar74 = vfmadd132ps_fma(auVar76,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar80);
  auVar76 = vfnmadd213ps_fma(auVar80,auVar81,auVar173);
  auVar75 = vfmadd132ps_fma(auVar76,auVar81,auVar81);
  auVar156._4_4_ = fVar143;
  auVar156._0_4_ = fVar143;
  auVar156._8_4_ = fVar143;
  auVar156._12_4_ = fVar143;
  auVar76 = vcvtdq2ps_avx(auVar83);
  auVar81 = vcvtdq2ps_avx(auVar84);
  auVar81 = vsubps_avx(auVar81,auVar76);
  auVar83 = vfmadd213ps_fma(auVar81,auVar156,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar133);
  auVar81 = vcvtdq2ps_avx512vl(auVar65);
  auVar81 = vsubps_avx(auVar81,auVar76);
  auVar84 = vfmadd213ps_fma(auVar81,auVar156,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar6);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar54 * 0x16 + 6);
  auVar81 = vpmovsxwd_avx(auVar19);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar76);
  auVar6 = vfmadd213ps_fma(auVar81,auVar156,auVar76);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar54 * 0x14 + 6);
  auVar76 = vpmovsxwd_avx(auVar72);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar54 * 0x18 + 6);
  auVar81 = vpmovsxwd_avx(auVar68);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82 = vsubps_avx(auVar81,auVar76);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar54 * 0x1d + 6);
  auVar81 = vpmovsxwd_avx(auVar69);
  auVar82 = vfmadd213ps_fma(auVar82,auVar156,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar81);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar54 * 0x21 + 6);
  auVar81 = vpmovsxwd_avx(auVar70);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar76);
  auVar19 = vfmadd213ps_fma(auVar81,auVar156,auVar76);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar54 * 0x1f + 6);
  auVar76 = vpmovsxwd_avx(auVar71);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar54 * 0x23 + 6);
  auVar81 = vpmovsxwd_avx(auVar73);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar76);
  auVar81 = vfmadd213ps_fma(auVar81,auVar156,auVar76);
  auVar76 = vsubps_avx512vl(auVar83,auVar66);
  auVar157._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar157._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar157._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar157._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx512vl(auVar84,auVar66);
  auVar66._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar66._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar66._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar66._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar6,auVar67);
  auVar161._0_4_ = auVar74._0_4_ * auVar76._0_4_;
  auVar161._4_4_ = auVar74._4_4_ * auVar76._4_4_;
  auVar161._8_4_ = auVar74._8_4_ * auVar76._8_4_;
  auVar161._12_4_ = auVar74._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar82,auVar67);
  auVar65._0_4_ = auVar74._0_4_ * auVar76._0_4_;
  auVar65._4_4_ = auVar74._4_4_ * auVar76._4_4_;
  auVar65._8_4_ = auVar74._8_4_ * auVar76._8_4_;
  auVar65._12_4_ = auVar74._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar19,auVar63);
  auVar67._0_4_ = auVar75._0_4_ * auVar76._0_4_;
  auVar67._4_4_ = auVar75._4_4_ * auVar76._4_4_;
  auVar67._8_4_ = auVar75._8_4_ * auVar76._8_4_;
  auVar67._12_4_ = auVar75._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar81,auVar63);
  auVar133._0_4_ = auVar75._0_4_ * auVar76._0_4_;
  auVar133._4_4_ = auVar75._4_4_ * auVar76._4_4_;
  auVar133._8_4_ = auVar75._8_4_ * auVar76._8_4_;
  auVar133._12_4_ = auVar75._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar157,auVar66);
  auVar81 = vpminsd_avx(auVar161,auVar65);
  auVar76 = vmaxps_avx(auVar76,auVar81);
  auVar81 = vpminsd_avx(auVar67,auVar133);
  uVar131 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar74._4_4_ = uVar131;
  auVar74._0_4_ = uVar131;
  auVar74._8_4_ = uVar131;
  auVar74._12_4_ = uVar131;
  auVar81 = vmaxps_avx512vl(auVar81,auVar74);
  auVar76 = vmaxps_avx(auVar76,auVar81);
  auVar75._8_4_ = 0x3f7ffffa;
  auVar75._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar75._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar76,auVar75);
  auVar76 = vpmaxsd_avx(auVar157,auVar66);
  auVar81 = vpmaxsd_avx(auVar161,auVar65);
  auVar76 = vminps_avx(auVar76,auVar81);
  auVar81 = vpmaxsd_avx(auVar67,auVar133);
  fVar160 = ray->tfar;
  auVar83._4_4_ = fVar160;
  auVar83._0_4_ = fVar160;
  auVar83._8_4_ = fVar160;
  auVar83._12_4_ = fVar160;
  auVar81 = vminps_avx512vl(auVar81,auVar83);
  auVar76 = vminps_avx(auVar76,auVar81);
  auVar84._8_4_ = 0x3f800003;
  auVar84._0_8_ = 0x3f8000033f800003;
  auVar84._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar84);
  uVar135 = vcmpps_avx512vl(local_270,auVar76,2);
  uVar20 = vpcmpgtd_avx512vl(auVar64,_DAT_01f4ad30);
  local_530 = pre;
  local_540 = ray;
  local_558 = context;
  local_548 = prim;
  for (uVar58 = CONCAT44((int)((ulong)ray >> 0x20),(uint)((byte)uVar135 & 0xf & (byte)uVar20));
      uVar58 != 0; uVar58 = (ulong)((uint)uVar58 & (uint)uVar58 + 0xf & (uint)uVar135)) {
    lVar56 = 0;
    for (uVar54 = uVar58; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      lVar56 = lVar56 + 1;
    }
    local_538 = (ulong)*(uint *)(local_548 + 2);
    pGVar8 = (context->scene->geometries).items[*(uint *)(local_548 + 2)].ptr;
    local_488 = (ulong)*(uint *)(local_548 + lVar56 * 4 + 6);
    uVar54 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)*(uint *)(local_548 + lVar56 * 4 + 6) *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar160 = (pGVar8->time_range).lower;
    fVar160 = pGVar8->fnumTimeSegments *
              (((ray->dir).field_0.m128[3] - fVar160) / ((pGVar8->time_range).upper - fVar160));
    auVar76 = vroundss_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),9);
    auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
    fVar160 = fVar160 - auVar76._0_4_;
    auVar81 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar160));
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar55 = (long)(int)auVar76._0_4_ * 0x38;
    lVar59 = *(long *)(_Var9 + 0x10 + lVar55);
    lVar10 = *(long *)(_Var9 + 0x38 + lVar55);
    lVar11 = *(long *)(_Var9 + 0x48 + lVar55);
    auVar63._4_4_ = fVar160;
    auVar63._0_4_ = fVar160;
    auVar63._8_4_ = fVar160;
    auVar63._12_4_ = fVar160;
    pfVar3 = (float *)(lVar10 + lVar11 * uVar54);
    auVar176._0_4_ = fVar160 * *pfVar3;
    auVar176._4_4_ = fVar160 * pfVar3[1];
    auVar176._8_4_ = fVar160 * pfVar3[2];
    auVar176._12_4_ = fVar160 * pfVar3[3];
    lVar56 = uVar54 + 1;
    auVar76 = vmulps_avx512vl(auVar63,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar56));
    p_Var12 = pGVar8[4].occlusionFilterN;
    auVar137._0_4_ = auVar81._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    local_3b0 = vfmadd231ps_fma(auVar176,auVar137,
                                *(undefined1 (*) [16])(*(long *)(_Var9 + lVar55) + lVar59 * uVar54))
    ;
    _local_2f0 = vfmadd231ps_avx512vl
                           (auVar76,auVar137,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar55) + lVar59 * lVar56));
    pfVar3 = (float *)(*(long *)(p_Var12 + lVar55 + 0x38) +
                      uVar54 * *(long *)(p_Var12 + lVar55 + 0x48));
    auVar177._0_4_ = fVar160 * *pfVar3;
    auVar177._4_4_ = fVar160 * pfVar3[1];
    auVar177._8_4_ = fVar160 * pfVar3[2];
    auVar177._12_4_ = fVar160 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var12 + lVar55 + 0x38) +
                      *(long *)(p_Var12 + lVar55 + 0x48) * lVar56);
    auVar180._0_4_ = fVar160 * *pfVar3;
    auVar180._4_4_ = fVar160 * pfVar3[1];
    auVar180._8_4_ = fVar160 * pfVar3[2];
    auVar180._12_4_ = fVar160 * pfVar3[3];
    auVar76 = vfmadd231ps_fma(auVar177,auVar137,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var12 + lVar55) +
                               *(long *)(p_Var12 + lVar55 + 0x10) * uVar54));
    auVar81 = vfmadd231ps_fma(auVar180,auVar137,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var12 + lVar55) +
                               *(long *)(p_Var12 + lVar55 + 0x10) * lVar56));
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar64._8_4_ = 0xbeaaaaab;
    auVar64._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar64._12_4_ = 0xbeaaaaab;
    local_3c0 = vfnmadd213ps_fma(auVar76,auVar64,local_3b0);
    local_3d0 = vfmadd213ps_avx512vl(auVar81,auVar64,_local_2f0);
    auVar76 = *(undefined1 (*) [16])(local_540->org).field_0.m128;
    auVar82 = vsubps_avx512vl(local_3b0,auVar76);
    uVar131 = auVar82._0_4_;
    auVar138._4_4_ = uVar131;
    auVar138._0_4_ = uVar131;
    auVar138._8_4_ = uVar131;
    auVar138._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar82,auVar82,0x55);
    aVar4 = (local_530->ray_space).vx.field_0;
    aVar5 = (local_530->ray_space).vy.field_0;
    fVar160 = (local_530->ray_space).vz.field_0.m128[0];
    fVar143 = (local_530->ray_space).vz.field_0.m128[1];
    fVar165 = (local_530->ray_space).vz.field_0.m128[2];
    fVar166 = (local_530->ray_space).vz.field_0.m128[3];
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar164._0_4_ = auVar82._0_4_ * fVar160;
    auVar164._4_4_ = auVar82._4_4_ * fVar143;
    auVar164._8_4_ = auVar82._8_4_ * fVar165;
    auVar164._12_4_ = auVar82._12_4_ * fVar166;
    auVar81 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar5,auVar81);
    auVar77 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar138);
    auVar82 = vsubps_avx512vl(local_3c0,auVar76);
    uVar131 = auVar82._0_4_;
    auVar139._4_4_ = uVar131;
    auVar139._0_4_ = uVar131;
    auVar139._8_4_ = uVar131;
    auVar139._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar169._0_4_ = auVar82._0_4_ * fVar160;
    auVar169._4_4_ = auVar82._4_4_ * fVar143;
    auVar169._8_4_ = auVar82._8_4_ * fVar165;
    auVar169._12_4_ = auVar82._12_4_ * fVar166;
    auVar81 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar81);
    auVar6 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar139);
    auVar82 = vsubps_avx512vl(local_3d0,auVar76);
    uVar131 = auVar82._0_4_;
    auVar140._4_4_ = uVar131;
    auVar140._0_4_ = uVar131;
    auVar140._8_4_ = uVar131;
    auVar140._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar171._0_4_ = fVar160 * auVar82._0_4_;
    auVar171._4_4_ = fVar143 * auVar82._4_4_;
    auVar171._8_4_ = fVar165 * auVar82._8_4_;
    auVar171._12_4_ = fVar166 * auVar82._12_4_;
    auVar81 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar81);
    auVar19 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar140);
    auVar82 = vsubps_avx512vl(_local_2f0,auVar76);
    uVar131 = auVar82._0_4_;
    auVar141._4_4_ = uVar131;
    auVar141._0_4_ = uVar131;
    auVar141._8_4_ = uVar131;
    auVar141._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar174._0_4_ = auVar82._0_4_ * fVar160;
    auVar174._4_4_ = auVar82._4_4_ * fVar143;
    auVar174._8_4_ = auVar82._8_4_ * fVar165;
    auVar174._12_4_ = auVar82._12_4_ * fVar166;
    auVar81 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar81);
    auVar72 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar141);
    local_550 = (long)iVar7;
    lVar56 = local_550 * 0x44;
    auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar56);
    uVar131 = auVar77._0_4_;
    local_340._4_4_ = uVar131;
    local_340._0_4_ = uVar131;
    local_340._8_4_ = uVar131;
    local_340._12_4_ = uVar131;
    local_340._16_4_ = uVar131;
    local_340._20_4_ = uVar131;
    local_340._24_4_ = uVar131;
    local_340._28_4_ = uVar131;
    auVar85._8_4_ = 1;
    auVar85._0_8_ = 0x100000001;
    auVar85._12_4_ = 1;
    auVar85._16_4_ = 1;
    auVar85._20_4_ = 1;
    auVar85._24_4_ = 1;
    auVar85._28_4_ = 1;
    local_320 = vpermps_avx2(auVar85,ZEXT1632(auVar77));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0x484);
    uVar131 = auVar6._0_4_;
    local_520._4_4_ = uVar131;
    local_520._0_4_ = uVar131;
    local_520._8_4_ = uVar131;
    local_520._12_4_ = uVar131;
    local_520._16_4_ = uVar131;
    local_520._20_4_ = uVar131;
    local_520._24_4_ = uVar131;
    local_520._28_4_ = uVar131;
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0x908);
    local_480 = vpermps_avx512vl(auVar85,ZEXT1632(auVar6));
    local_400 = vbroadcastss_avx512vl(auVar19);
    local_420 = vpermps_avx512vl(auVar85,ZEXT1632(auVar19));
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0xd8c);
    fVar160 = auVar72._0_4_;
    local_460._4_4_ = fVar160;
    local_460._0_4_ = fVar160;
    local_460._8_4_ = fVar160;
    local_460._12_4_ = fVar160;
    local_460._16_4_ = fVar160;
    local_460._20_4_ = fVar160;
    local_460._24_4_ = fVar160;
    local_460._28_4_ = fVar160;
    local_440 = vpermps_avx512vl(auVar85,ZEXT1632(auVar72));
    auVar85 = vmulps_avx512vl(local_460,auVar97);
    auVar86 = vmulps_avx512vl(local_440,auVar97);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_400);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_420);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_520);
    auVar87 = vfmadd231ps_avx512vl(auVar86,auVar100,local_480);
    auVar88 = vfmadd231ps_avx512vl(auVar85,auVar99,local_340);
    auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar56);
    auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0x484);
    auVar89 = vfmadd231ps_avx512vl(auVar87,auVar99,local_320);
    auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0x908);
    auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0xd8c);
    auVar90 = vmulps_avx512vl(local_460,auVar96);
    auVar91 = vmulps_avx512vl(local_440,auVar96);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,local_400);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_420);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_520);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_480);
    auVar68 = vfmadd231ps_fma(auVar90,auVar85,local_340);
    auVar69 = vfmadd231ps_fma(auVar91,auVar85,local_320);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar68),auVar88);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar69),auVar89);
    auVar92 = vmulps_avx512vl(auVar89,auVar90);
    auVar93 = vmulps_avx512vl(auVar88,auVar91);
    auVar92 = vsubps_avx512vl(auVar92,auVar93);
    auVar81 = vshufps_avx(local_3b0,local_3b0,0xff);
    uVar135 = auVar81._0_8_;
    local_80._8_8_ = uVar135;
    local_80._0_8_ = uVar135;
    local_80._16_8_ = uVar135;
    local_80._24_8_ = uVar135;
    auVar81 = vshufps_avx(local_3c0,local_3c0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx(local_3d0,local_3d0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx512vl(_local_2f0,_local_2f0,0xff);
    uVar135 = auVar81._0_8_;
    register0x000012c8 = uVar135;
    local_e0 = uVar135;
    register0x000012d0 = uVar135;
    register0x000012d8 = uVar135;
    auVar93 = vmulps_avx512vl(_local_e0,auVar97);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_a0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_80);
    auVar94 = vmulps_avx512vl(_local_e0,auVar96);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar87,local_c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar86,local_a0);
    auVar70 = vfmadd231ps_fma(auVar94,auVar85,local_80);
    auVar94 = vmulps_avx512vl(auVar91,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar90);
    auVar95 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar70));
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vmulps_avx512vl(auVar95,auVar94);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    uVar135 = vcmpps_avx512vl(auVar92,auVar94,2);
    auVar74 = local_3b0;
    auVar81 = vblendps_avx(auVar77,local_3b0,8);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar82 = vandps_avx512vl(auVar81,auVar75);
    auVar73 = local_3c0;
    auVar81 = vblendps_avx(auVar6,local_3c0,8);
    auVar81 = vandps_avx512vl(auVar81,auVar75);
    auVar82 = vmaxps_avx(auVar82,auVar81);
    auVar71 = local_3d0;
    auVar81 = vblendps_avx(auVar19,local_3d0,8);
    auVar83 = vandps_avx512vl(auVar81,auVar75);
    auVar81 = vblendps_avx(auVar72,_local_2f0,8);
    auVar81 = vandps_avx512vl(auVar81,auVar75);
    auVar81 = vmaxps_avx(auVar83,auVar81);
    auVar81 = vmaxps_avx(auVar82,auVar81);
    auVar82 = vmovshdup_avx(auVar81);
    auVar82 = vmaxss_avx(auVar82,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar81 = vmaxss_avx(auVar81,auVar82);
    local_2e0._0_4_ = (undefined4)iVar7;
    register0x00001504 = local_3d0._4_12_;
    auVar94._4_4_ = local_2e0._0_4_;
    auVar94._0_4_ = local_2e0._0_4_;
    auVar94._8_4_ = local_2e0._0_4_;
    auVar94._12_4_ = local_2e0._0_4_;
    auVar94._16_4_ = local_2e0._0_4_;
    auVar94._20_4_ = local_2e0._0_4_;
    auVar94._24_4_ = local_2e0._0_4_;
    auVar94._28_4_ = local_2e0._0_4_;
    uVar20 = vcmpps_avx512vl(auVar94,_DAT_01f7b060,0xe);
    bVar60 = (byte)uVar135 & (byte)uVar20;
    local_2a0 = auVar81._0_4_ * 4.7683716e-07;
    auVar92._8_4_ = 2;
    auVar92._0_8_ = 0x200000002;
    auVar92._12_4_ = 2;
    auVar92._16_4_ = 2;
    auVar92._20_4_ = 2;
    auVar92._24_4_ = 2;
    auVar92._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar92,ZEXT1632(auVar77));
    local_120 = vpermps_avx512vl(auVar92,ZEXT1632(auVar6));
    local_140 = vpermps_avx512vl(auVar92,ZEXT1632(auVar19));
    local_3a0 = vpermps_avx2(auVar92,ZEXT1632(auVar72));
    auVar81 = local_100._0_16_;
    if (bVar60 == 0) {
      bVar57 = false;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar185 = ZEXT3264(auVar99);
      auVar81 = vxorps_avx512vl(auVar81,auVar81);
      auVar186 = ZEXT1664(auVar81);
      auVar187 = ZEXT3264(local_340);
      auVar188 = ZEXT3264(local_320);
      auVar184 = ZEXT3264(local_520);
      auVar190 = ZEXT3264(local_480);
      auVar192 = ZEXT3264(local_400);
      auVar191 = ZEXT3264(local_420);
      auVar183 = ZEXT3264(local_460);
      auVar189 = ZEXT3264(local_440);
      auVar99 = ZEXT1632(auVar76);
      local_3d0 = auVar71;
      local_3c0 = auVar73;
      local_3b0 = auVar74;
    }
    else {
      local_360 = ZEXT1632(auVar76);
      auVar96 = vmulps_avx512vl(local_3a0,auVar96);
      auVar87 = vfmadd213ps_avx512vl(auVar87,local_140,auVar96);
      auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar87);
      auVar92 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
      auVar97 = vmulps_avx512vl(local_3a0,auVar97);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
      auVar86 = vfmadd213ps_avx512vl(auVar100,local_120,auVar98);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0x1210);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0x1694);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0x1b18);
      auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar56 + 0x1f9c);
      auVar94 = vfmadd213ps_avx512vl(auVar99,local_100,auVar86);
      auVar99 = vmulps_avx512vl(local_460,auVar85);
      auVar86 = vmulps_avx512vl(local_440,auVar85);
      auVar85 = vmulps_avx512vl(local_3a0,auVar85);
      auVar76 = vfmadd231ps_fma(auVar99,auVar97,local_400);
      auVar99 = vfmadd231ps_avx512vl(auVar86,auVar97,local_420);
      auVar97 = vfmadd231ps_avx512vl(auVar85,local_140,auVar97);
      auVar85 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar98,local_520);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_480);
      auVar86 = vfmadd231ps_avx512vl(auVar97,local_120,auVar98);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_340);
      auVar87 = vfmadd231ps_avx512vl(auVar99,auVar100,local_320);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0x1210);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0x1f9c);
      auVar96 = vfmadd231ps_avx512vl(auVar86,local_100,auVar100);
      auVar86._4_4_ = fVar160 * auVar97._4_4_;
      auVar86._0_4_ = fVar160 * auVar97._0_4_;
      auVar86._8_4_ = fVar160 * auVar97._8_4_;
      auVar86._12_4_ = fVar160 * auVar97._12_4_;
      auVar86._16_4_ = fVar160 * auVar97._16_4_;
      auVar86._20_4_ = fVar160 * auVar97._20_4_;
      auVar86._24_4_ = fVar160 * auVar97._24_4_;
      auVar86._28_4_ = auVar100._28_4_;
      auVar100 = vmulps_avx512vl(local_440,auVar97);
      auVar97 = vmulps_avx512vl(local_3a0,auVar97);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_400);
      auVar95 = vfmadd231ps_avx512vl(auVar100,auVar98,local_420);
      auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar56 + 0x1694);
      auVar97 = vfmadd231ps_avx512vl(auVar86,auVar100,local_520);
      auVar86 = vfmadd231ps_avx512vl(auVar95,auVar100,local_480);
      auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar99,local_340);
      auVar97 = vfmadd231ps_avx512vl(auVar86,auVar99,local_320);
      auVar86 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
      auVar181._8_4_ = 0x7fffffff;
      auVar181._0_8_ = 0x7fffffff7fffffff;
      auVar181._12_4_ = 0x7fffffff;
      auVar181._16_4_ = 0x7fffffff;
      auVar181._20_4_ = 0x7fffffff;
      auVar181._24_4_ = 0x7fffffff;
      auVar181._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(auVar85,auVar181);
      auVar100 = vandps_avx(auVar87,auVar181);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vandps_avx(auVar96,auVar181);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      auVar96 = vbroadcastss_avx512vl(ZEXT416((uint)local_2a0));
      uVar54 = vcmpps_avx512vl(auVar99,auVar96,1);
      bVar57 = (bool)((byte)uVar54 & 1);
      auVar111._0_4_ = (float)((uint)bVar57 * auVar90._0_4_ | (uint)!bVar57 * auVar85._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * auVar85._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * auVar85._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * auVar85._12_4_);
      bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * auVar85._16_4_);
      bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * auVar85._20_4_);
      bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar57 * auVar90._24_4_ | (uint)!bVar57 * auVar85._24_4_);
      bVar57 = SUB81(uVar54 >> 7,0);
      auVar111._28_4_ = (uint)bVar57 * auVar90._28_4_ | (uint)!bVar57 * auVar85._28_4_;
      bVar57 = (bool)((byte)uVar54 & 1);
      auVar101._0_4_ = (float)((uint)bVar57 * auVar91._0_4_ | (uint)!bVar57 * auVar87._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar57 * auVar91._4_4_ | (uint)!bVar57 * auVar87._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar57 * auVar91._8_4_ | (uint)!bVar57 * auVar87._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar57 * auVar91._12_4_ | (uint)!bVar57 * auVar87._12_4_);
      bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar57 * auVar91._16_4_ | (uint)!bVar57 * auVar87._16_4_);
      bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar57 * auVar91._20_4_ | (uint)!bVar57 * auVar87._20_4_);
      bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar57 * auVar91._24_4_ | (uint)!bVar57 * auVar87._24_4_);
      bVar57 = SUB81(uVar54 >> 7,0);
      auVar101._28_4_ = (uint)bVar57 * auVar91._28_4_ | (uint)!bVar57 * auVar87._28_4_;
      auVar99 = vandps_avx(auVar181,auVar98);
      auVar100 = vandps_avx(auVar97,auVar181);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vandps_avx(auVar86,auVar181);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      uVar54 = vcmpps_avx512vl(auVar99,auVar96,1);
      bVar57 = (bool)((byte)uVar54 & 1);
      auVar102._0_4_ = (float)((uint)bVar57 * auVar90._0_4_ | (uint)!bVar57 * auVar98._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * auVar98._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * auVar98._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * auVar98._12_4_);
      bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * auVar98._16_4_);
      bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * auVar98._20_4_);
      bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar57 * auVar90._24_4_ | (uint)!bVar57 * auVar98._24_4_);
      bVar57 = SUB81(uVar54 >> 7,0);
      auVar102._28_4_ = (uint)bVar57 * auVar90._28_4_ | (uint)!bVar57 * auVar98._28_4_;
      bVar57 = (bool)((byte)uVar54 & 1);
      auVar103._0_4_ = (float)((uint)bVar57 * auVar91._0_4_ | (uint)!bVar57 * auVar97._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar57 * auVar91._4_4_ | (uint)!bVar57 * auVar97._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar57 * auVar91._8_4_ | (uint)!bVar57 * auVar97._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar57 * auVar91._12_4_ | (uint)!bVar57 * auVar97._12_4_);
      bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar57 * auVar91._16_4_ | (uint)!bVar57 * auVar97._16_4_);
      bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar57 * auVar91._20_4_ | (uint)!bVar57 * auVar97._20_4_);
      bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar57 * auVar91._24_4_ | (uint)!bVar57 * auVar97._24_4_);
      bVar57 = SUB81(uVar54 >> 7,0);
      auVar103._28_4_ = (uint)bVar57 * auVar91._28_4_ | (uint)!bVar57 * auVar97._28_4_;
      auVar84 = vxorps_avx512vl(auVar81,auVar81);
      auVar186 = ZEXT1664(auVar84);
      auVar99 = vfmadd213ps_avx512vl(auVar111,auVar111,ZEXT1632(auVar84));
      auVar76 = vfmadd231ps_fma(auVar99,auVar101,auVar101);
      auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
      fVar160 = auVar98._0_4_;
      fVar143 = auVar98._4_4_;
      fVar165 = auVar98._8_4_;
      fVar166 = auVar98._12_4_;
      fVar167 = auVar98._16_4_;
      fVar162 = auVar98._20_4_;
      fVar61 = auVar98._24_4_;
      auVar99._4_4_ = fVar143 * fVar143 * fVar143 * auVar76._4_4_ * -0.5;
      auVar99._0_4_ = fVar160 * fVar160 * fVar160 * auVar76._0_4_ * -0.5;
      auVar99._8_4_ = fVar165 * fVar165 * fVar165 * auVar76._8_4_ * -0.5;
      auVar99._12_4_ = fVar166 * fVar166 * fVar166 * auVar76._12_4_ * -0.5;
      auVar99._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar99._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar99._24_4_ = fVar61 * fVar61 * fVar61 * -0.0;
      auVar99._28_4_ = 0;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar98);
      auVar100._4_4_ = auVar101._4_4_ * auVar99._4_4_;
      auVar100._0_4_ = auVar101._0_4_ * auVar99._0_4_;
      auVar100._8_4_ = auVar101._8_4_ * auVar99._8_4_;
      auVar100._12_4_ = auVar101._12_4_ * auVar99._12_4_;
      auVar100._16_4_ = auVar101._16_4_ * auVar99._16_4_;
      auVar100._20_4_ = auVar101._20_4_ * auVar99._20_4_;
      auVar100._24_4_ = auVar101._24_4_ * auVar99._24_4_;
      auVar100._28_4_ = auVar98._28_4_;
      auVar98._4_4_ = auVar99._4_4_ * -auVar111._4_4_;
      auVar98._0_4_ = auVar99._0_4_ * -auVar111._0_4_;
      auVar98._8_4_ = auVar99._8_4_ * -auVar111._8_4_;
      auVar98._12_4_ = auVar99._12_4_ * -auVar111._12_4_;
      auVar98._16_4_ = auVar99._16_4_ * -auVar111._16_4_;
      auVar98._20_4_ = auVar99._20_4_ * -auVar111._20_4_;
      auVar98._24_4_ = auVar99._24_4_ * -auVar111._24_4_;
      auVar98._28_4_ = auVar111._28_4_ ^ 0x80000000;
      auVar86 = vmulps_avx512vl(auVar99,ZEXT1632(auVar84));
      auVar90 = ZEXT1632(auVar84);
      auVar97 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar90);
      auVar76 = vfmadd231ps_fma(auVar97,auVar103,auVar103);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
      fVar160 = auVar96._0_4_;
      fVar143 = auVar96._4_4_;
      fVar165 = auVar96._8_4_;
      fVar166 = auVar96._12_4_;
      fVar167 = auVar96._16_4_;
      fVar162 = auVar96._20_4_;
      fVar61 = auVar96._24_4_;
      auVar97._4_4_ = fVar143 * fVar143 * fVar143 * auVar76._4_4_ * -0.5;
      auVar97._0_4_ = fVar160 * fVar160 * fVar160 * auVar76._0_4_ * -0.5;
      auVar97._8_4_ = fVar165 * fVar165 * fVar165 * auVar76._8_4_ * -0.5;
      auVar97._12_4_ = fVar166 * fVar166 * fVar166 * auVar76._12_4_ * -0.5;
      auVar97._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar97._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar97._24_4_ = fVar61 * fVar61 * fVar61 * -0.0;
      auVar97._28_4_ = 0;
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar96);
      auVar87._4_4_ = auVar103._4_4_ * auVar97._4_4_;
      auVar87._0_4_ = auVar103._0_4_ * auVar97._0_4_;
      auVar87._8_4_ = auVar103._8_4_ * auVar97._8_4_;
      auVar87._12_4_ = auVar103._12_4_ * auVar97._12_4_;
      auVar87._16_4_ = auVar103._16_4_ * auVar97._16_4_;
      auVar87._20_4_ = auVar103._20_4_ * auVar97._20_4_;
      auVar87._24_4_ = auVar103._24_4_ * auVar97._24_4_;
      auVar87._28_4_ = auVar96._28_4_;
      auVar96._4_4_ = -auVar102._4_4_ * auVar97._4_4_;
      auVar96._0_4_ = -auVar102._0_4_ * auVar97._0_4_;
      auVar96._8_4_ = -auVar102._8_4_ * auVar97._8_4_;
      auVar96._12_4_ = -auVar102._12_4_ * auVar97._12_4_;
      auVar96._16_4_ = -auVar102._16_4_ * auVar97._16_4_;
      auVar96._20_4_ = -auVar102._20_4_ * auVar97._20_4_;
      auVar96._24_4_ = -auVar102._24_4_ * auVar97._24_4_;
      auVar96._28_4_ = auVar99._28_4_;
      auVar99 = vmulps_avx512vl(auVar97,auVar90);
      auVar76 = vfmadd213ps_fma(auVar100,auVar93,auVar88);
      auVar81 = vfmadd213ps_fma(auVar98,auVar93,auVar89);
      auVar97 = vfmadd213ps_avx512vl(auVar86,auVar93,auVar94);
      auVar85 = vfmadd213ps_avx512vl(auVar87,ZEXT1632(auVar70),ZEXT1632(auVar68));
      auVar72 = vfnmadd213ps_fma(auVar100,auVar93,auVar88);
      auVar88 = ZEXT1632(auVar70);
      auVar82 = vfmadd213ps_fma(auVar96,auVar88,ZEXT1632(auVar69));
      auVar75 = vfnmadd213ps_fma(auVar98,auVar93,auVar89);
      auVar77 = vfmadd213ps_fma(auVar99,auVar88,auVar92);
      auVar100 = vfnmadd231ps_avx512vl(auVar94,auVar93,auVar86);
      auVar68 = vfnmadd213ps_fma(auVar87,auVar88,ZEXT1632(auVar68));
      auVar69 = vfnmadd213ps_fma(auVar96,auVar88,ZEXT1632(auVar69));
      auVar83 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar70),auVar99);
      auVar98 = vsubps_avx512vl(auVar85,ZEXT1632(auVar72));
      auVar99 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar75));
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar77),auVar100);
      auVar87 = vmulps_avx512vl(auVar99,auVar100);
      auVar6 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar75),auVar86);
      auVar88._4_4_ = auVar72._4_4_ * auVar86._4_4_;
      auVar88._0_4_ = auVar72._0_4_ * auVar86._0_4_;
      auVar88._8_4_ = auVar72._8_4_ * auVar86._8_4_;
      auVar88._12_4_ = auVar72._12_4_ * auVar86._12_4_;
      auVar88._16_4_ = auVar86._16_4_ * 0.0;
      auVar88._20_4_ = auVar86._20_4_ * 0.0;
      auVar88._24_4_ = auVar86._24_4_ * 0.0;
      auVar88._28_4_ = auVar86._28_4_;
      auVar86 = vfmsub231ps_avx512vl(auVar88,auVar100,auVar98);
      auVar89._4_4_ = auVar75._4_4_ * auVar98._4_4_;
      auVar89._0_4_ = auVar75._0_4_ * auVar98._0_4_;
      auVar89._8_4_ = auVar75._8_4_ * auVar98._8_4_;
      auVar89._12_4_ = auVar75._12_4_ * auVar98._12_4_;
      auVar89._16_4_ = auVar98._16_4_ * 0.0;
      auVar89._20_4_ = auVar98._20_4_ * 0.0;
      auVar89._24_4_ = auVar98._24_4_ * 0.0;
      auVar89._28_4_ = auVar98._28_4_;
      auVar19 = vfmsub231ps_fma(auVar89,ZEXT1632(auVar72),auVar99);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar90,auVar86);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,ZEXT1632(auVar6));
      auVar92 = ZEXT1632(auVar84);
      uVar54 = vcmpps_avx512vl(auVar99,auVar92,2);
      bVar52 = (byte)uVar54;
      fVar61 = (float)((uint)(bVar52 & 1) * auVar76._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar68._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      fVar122 = (float)((uint)bVar57 * auVar76._4_4_ | (uint)!bVar57 * auVar68._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      fVar124 = (float)((uint)bVar57 * auVar76._8_4_ | (uint)!bVar57 * auVar68._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      fVar127 = (float)((uint)bVar57 * auVar76._12_4_ | (uint)!bVar57 * auVar68._12_4_);
      auVar87 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar122,fVar61))));
      fVar62 = (float)((uint)(bVar52 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar69._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      fVar123 = (float)((uint)bVar57 * auVar81._4_4_ | (uint)!bVar57 * auVar69._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      fVar125 = (float)((uint)bVar57 * auVar81._8_4_ | (uint)!bVar57 * auVar69._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      fVar128 = (float)((uint)bVar57 * auVar81._12_4_ | (uint)!bVar57 * auVar69._12_4_);
      auVar96 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar123,fVar62))));
      auVar104._0_4_ =
           (float)((uint)(bVar52 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar83._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar57 * auVar97._4_4_ | (uint)!bVar57 * auVar83._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar57 * auVar97._8_4_ | (uint)!bVar57 * auVar83._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar57 * auVar97._12_4_ | (uint)!bVar57 * auVar83._12_4_);
      fVar143 = (float)((uint)((byte)(uVar54 >> 4) & 1) * auVar97._16_4_);
      auVar104._16_4_ = fVar143;
      fVar160 = (float)((uint)((byte)(uVar54 >> 5) & 1) * auVar97._20_4_);
      auVar104._20_4_ = fVar160;
      fVar165 = (float)((uint)((byte)(uVar54 >> 6) & 1) * auVar97._24_4_);
      auVar104._24_4_ = fVar165;
      iVar1 = (uint)(byte)(uVar54 >> 7) * auVar97._28_4_;
      auVar104._28_4_ = iVar1;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar72),auVar85);
      auVar105._0_4_ = (uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar6._0_4_
      ;
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar57 * auVar98._4_4_ | (uint)!bVar57 * auVar6._4_4_;
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar57 * auVar98._8_4_ | (uint)!bVar57 * auVar6._8_4_;
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar57 * auVar98._12_4_ | (uint)!bVar57 * auVar6._12_4_;
      auVar105._16_4_ = (uint)((byte)(uVar54 >> 4) & 1) * auVar98._16_4_;
      auVar105._20_4_ = (uint)((byte)(uVar54 >> 5) & 1) * auVar98._20_4_;
      auVar105._24_4_ = (uint)((byte)(uVar54 >> 6) & 1) * auVar98._24_4_;
      auVar105._28_4_ = (uint)(byte)(uVar54 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar82));
      auVar106._0_4_ =
           (float)((uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar81._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar57 * auVar98._4_4_ | (uint)!bVar57 * auVar81._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar57 * auVar98._8_4_ | (uint)!bVar57 * auVar81._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar57 * auVar98._12_4_ | (uint)!bVar57 * auVar81._12_4_);
      fVar166 = (float)((uint)((byte)(uVar54 >> 4) & 1) * auVar98._16_4_);
      auVar106._16_4_ = fVar166;
      fVar167 = (float)((uint)((byte)(uVar54 >> 5) & 1) * auVar98._20_4_);
      auVar106._20_4_ = fVar167;
      fVar162 = (float)((uint)((byte)(uVar54 >> 6) & 1) * auVar98._24_4_);
      auVar106._24_4_ = fVar162;
      auVar106._28_4_ = (uint)(byte)(uVar54 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(auVar100,ZEXT1632(auVar77));
      auVar107._0_4_ =
           (float)((uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar97._0_4_);
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar57 * auVar98._4_4_ | (uint)!bVar57 * auVar97._4_4_);
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar57 * auVar98._8_4_ | (uint)!bVar57 * auVar97._8_4_);
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar57 * auVar98._12_4_ | (uint)!bVar57 * auVar97._12_4_);
      bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar57 * auVar98._16_4_ | (uint)!bVar57 * auVar97._16_4_);
      bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar57 * auVar98._20_4_ | (uint)!bVar57 * auVar97._20_4_);
      bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar57 * auVar98._24_4_ | (uint)!bVar57 * auVar97._24_4_);
      bVar57 = SUB81(uVar54 >> 7,0);
      auVar107._28_4_ = (uint)bVar57 * auVar98._28_4_ | (uint)!bVar57 * auVar97._28_4_;
      auVar108._0_4_ =
           (uint)(bVar52 & 1) * (int)auVar72._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar85._0_4_;
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar57 * (int)auVar72._4_4_ | (uint)!bVar57 * auVar85._4_4_;
      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar57 * (int)auVar72._8_4_ | (uint)!bVar57 * auVar85._8_4_;
      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar57 * (int)auVar72._12_4_ | (uint)!bVar57 * auVar85._12_4_;
      auVar108._16_4_ = (uint)!(bool)((byte)(uVar54 >> 4) & 1) * auVar85._16_4_;
      auVar108._20_4_ = (uint)!(bool)((byte)(uVar54 >> 5) & 1) * auVar85._20_4_;
      auVar108._24_4_ = (uint)!(bool)((byte)(uVar54 >> 6) & 1) * auVar85._24_4_;
      auVar108._28_4_ = (uint)!SUB81(uVar54 >> 7,0) * auVar85._28_4_;
      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar54 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar109._0_4_ =
           (uint)(bVar52 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar77._0_4_;
      bVar13 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar77._4_4_;
      bVar13 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar77._8_4_;
      bVar13 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar77._12_4_;
      auVar109._16_4_ = (uint)((byte)(uVar54 >> 4) & 1) * auVar100._16_4_;
      auVar109._20_4_ = (uint)((byte)(uVar54 >> 5) & 1) * auVar100._20_4_;
      auVar109._24_4_ = (uint)((byte)(uVar54 >> 6) & 1) * auVar100._24_4_;
      iVar2 = (uint)(byte)(uVar54 >> 7) * auVar100._28_4_;
      auVar109._28_4_ = iVar2;
      auVar88 = vsubps_avx512vl(auVar108,auVar87);
      auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar75._12_4_ |
                                               (uint)!bVar16 * auVar82._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar75._8_4_ |
                                                        (uint)!bVar14 * auVar82._8_4_,
                                                        CONCAT44((uint)bVar57 * (int)auVar75._4_4_ |
                                                                 (uint)!bVar57 * auVar82._4_4_,
                                                                 (uint)(bVar52 & 1) *
                                                                 (int)auVar75._0_4_ |
                                                                 (uint)!(bool)(bVar52 & 1) *
                                                                 auVar82._0_4_)))),auVar96);
      auVar98 = vsubps_avx(auVar109,auVar104);
      auVar97 = vsubps_avx(auVar87,auVar105);
      auVar85 = vsubps_avx(auVar96,auVar106);
      auVar86 = vsubps_avx(auVar104,auVar107);
      auVar90._4_4_ = auVar98._4_4_ * fVar122;
      auVar90._0_4_ = auVar98._0_4_ * fVar61;
      auVar90._8_4_ = auVar98._8_4_ * fVar124;
      auVar90._12_4_ = auVar98._12_4_ * fVar127;
      auVar90._16_4_ = auVar98._16_4_ * 0.0;
      auVar90._20_4_ = auVar98._20_4_ * 0.0;
      auVar90._24_4_ = auVar98._24_4_ * 0.0;
      auVar90._28_4_ = iVar2;
      auVar76 = vfmsub231ps_fma(auVar90,auVar104,auVar88);
      auVar91._4_4_ = fVar123 * auVar88._4_4_;
      auVar91._0_4_ = fVar62 * auVar88._0_4_;
      auVar91._8_4_ = fVar125 * auVar88._8_4_;
      auVar91._12_4_ = fVar128 * auVar88._12_4_;
      auVar91._16_4_ = auVar88._16_4_ * 0.0;
      auVar91._20_4_ = auVar88._20_4_ * 0.0;
      auVar91._24_4_ = auVar88._24_4_ * 0.0;
      auVar91._28_4_ = auVar99._28_4_;
      auVar81 = vfmsub231ps_fma(auVar91,auVar87,auVar100);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar92,ZEXT1632(auVar76));
      auVar152._0_4_ = auVar100._0_4_ * auVar104._0_4_;
      auVar152._4_4_ = auVar100._4_4_ * auVar104._4_4_;
      auVar152._8_4_ = auVar100._8_4_ * auVar104._8_4_;
      auVar152._12_4_ = auVar100._12_4_ * auVar104._12_4_;
      auVar152._16_4_ = auVar100._16_4_ * fVar143;
      auVar152._20_4_ = auVar100._20_4_ * fVar160;
      auVar152._24_4_ = auVar100._24_4_ * fVar165;
      auVar152._28_4_ = 0;
      auVar76 = vfmsub231ps_fma(auVar152,auVar96,auVar98);
      auVar89 = vfmadd231ps_avx512vl(auVar99,auVar92,ZEXT1632(auVar76));
      auVar99 = vmulps_avx512vl(auVar86,auVar105);
      auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar107);
      auVar95._4_4_ = auVar85._4_4_ * auVar107._4_4_;
      auVar95._0_4_ = auVar85._0_4_ * auVar107._0_4_;
      auVar95._8_4_ = auVar85._8_4_ * auVar107._8_4_;
      auVar95._12_4_ = auVar85._12_4_ * auVar107._12_4_;
      auVar95._16_4_ = auVar85._16_4_ * auVar107._16_4_;
      auVar95._20_4_ = auVar85._20_4_ * auVar107._20_4_;
      auVar95._24_4_ = auVar85._24_4_ * auVar107._24_4_;
      auVar95._28_4_ = auVar107._28_4_;
      auVar76 = vfmsub231ps_fma(auVar95,auVar106,auVar86);
      auVar153._0_4_ = auVar106._0_4_ * auVar97._0_4_;
      auVar153._4_4_ = auVar106._4_4_ * auVar97._4_4_;
      auVar153._8_4_ = auVar106._8_4_ * auVar97._8_4_;
      auVar153._12_4_ = auVar106._12_4_ * auVar97._12_4_;
      auVar153._16_4_ = fVar166 * auVar97._16_4_;
      auVar153._20_4_ = fVar167 * auVar97._20_4_;
      auVar153._24_4_ = fVar162 * auVar97._24_4_;
      auVar153._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar153,auVar85,auVar105);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar92,auVar99);
      auVar90 = vfmadd231ps_avx512vl(auVar99,auVar92,ZEXT1632(auVar76));
      auVar99 = vmaxps_avx(auVar89,auVar90);
      uVar135 = vcmpps_avx512vl(auVar99,auVar92,2);
      bVar60 = bVar60 & (byte)uVar135;
      auVar187 = ZEXT3264(local_340);
      auVar188 = ZEXT3264(local_320);
      auVar184 = ZEXT3264(local_520);
      auVar190 = ZEXT3264(local_480);
      auVar192 = ZEXT3264(local_400);
      auVar191 = ZEXT3264(local_420);
      auVar183 = ZEXT3264(local_460);
      auVar189 = ZEXT3264(local_440);
      if (bVar60 == 0) {
        bVar57 = false;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar185 = ZEXT3264(auVar99);
        auVar99 = local_360;
        local_3d0 = auVar71;
        local_3c0 = auVar73;
        local_3b0 = auVar74;
      }
      else {
        auVar28._4_4_ = auVar86._4_4_ * auVar100._4_4_;
        auVar28._0_4_ = auVar86._0_4_ * auVar100._0_4_;
        auVar28._8_4_ = auVar86._8_4_ * auVar100._8_4_;
        auVar28._12_4_ = auVar86._12_4_ * auVar100._12_4_;
        auVar28._16_4_ = auVar86._16_4_ * auVar100._16_4_;
        auVar28._20_4_ = auVar86._20_4_ * auVar100._20_4_;
        auVar28._24_4_ = auVar86._24_4_ * auVar100._24_4_;
        auVar28._28_4_ = auVar99._28_4_;
        auVar82 = vfmsub231ps_fma(auVar28,auVar85,auVar98);
        auVar29._4_4_ = auVar98._4_4_ * auVar97._4_4_;
        auVar29._0_4_ = auVar98._0_4_ * auVar97._0_4_;
        auVar29._8_4_ = auVar98._8_4_ * auVar97._8_4_;
        auVar29._12_4_ = auVar98._12_4_ * auVar97._12_4_;
        auVar29._16_4_ = auVar98._16_4_ * auVar97._16_4_;
        auVar29._20_4_ = auVar98._20_4_ * auVar97._20_4_;
        auVar29._24_4_ = auVar98._24_4_ * auVar97._24_4_;
        auVar29._28_4_ = auVar98._28_4_;
        auVar81 = vfmsub231ps_fma(auVar29,auVar88,auVar86);
        auVar30._4_4_ = auVar85._4_4_ * auVar88._4_4_;
        auVar30._0_4_ = auVar85._0_4_ * auVar88._0_4_;
        auVar30._8_4_ = auVar85._8_4_ * auVar88._8_4_;
        auVar30._12_4_ = auVar85._12_4_ * auVar88._12_4_;
        auVar30._16_4_ = auVar85._16_4_ * auVar88._16_4_;
        auVar30._20_4_ = auVar85._20_4_ * auVar88._20_4_;
        auVar30._24_4_ = auVar85._24_4_ * auVar88._24_4_;
        auVar30._28_4_ = auVar85._28_4_;
        auVar77 = vfmsub231ps_fma(auVar30,auVar97,auVar100);
        auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar77));
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar82),auVar92);
        auVar99 = vrcp14ps_avx512vl(auVar100);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar185 = ZEXT3264(auVar98);
        auVar97 = vfnmadd213ps_avx512vl(auVar99,auVar100,auVar98);
        auVar76 = vfmadd132ps_fma(auVar97,auVar99,auVar99);
        auVar31._4_4_ = auVar77._4_4_ * auVar104._4_4_;
        auVar31._0_4_ = auVar77._0_4_ * auVar104._0_4_;
        auVar31._8_4_ = auVar77._8_4_ * auVar104._8_4_;
        auVar31._12_4_ = auVar77._12_4_ * auVar104._12_4_;
        auVar31._16_4_ = fVar143 * 0.0;
        auVar31._20_4_ = fVar160 * 0.0;
        auVar31._24_4_ = fVar165 * 0.0;
        auVar31._28_4_ = iVar1;
        auVar81 = vfmadd231ps_fma(auVar31,auVar96,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar87,ZEXT1632(auVar82));
        fVar143 = auVar76._0_4_;
        fVar165 = auVar76._4_4_;
        fVar166 = auVar76._8_4_;
        fVar167 = auVar76._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar167,
                                       CONCAT48(auVar81._8_4_ * fVar166,
                                                CONCAT44(auVar81._4_4_ * fVar165,
                                                         auVar81._0_4_ * fVar143))));
        auVar163._8_4_ = 3;
        auVar163._0_8_ = 0x300000003;
        auVar163._12_4_ = 3;
        auVar163._16_4_ = 3;
        auVar163._20_4_ = 3;
        auVar163._24_4_ = 3;
        auVar163._28_4_ = 3;
        auVar99 = vpermps_avx512vl(auVar163,local_360);
        uVar135 = vcmpps_avx512vl(auVar99,local_220,2);
        fVar160 = local_540->tfar;
        auVar23._4_4_ = fVar160;
        auVar23._0_4_ = fVar160;
        auVar23._8_4_ = fVar160;
        auVar23._12_4_ = fVar160;
        auVar23._16_4_ = fVar160;
        auVar23._20_4_ = fVar160;
        auVar23._24_4_ = fVar160;
        auVar23._28_4_ = fVar160;
        uVar20 = vcmpps_avx512vl(local_220,auVar23,2);
        bVar60 = (byte)uVar135 & (byte)uVar20 & bVar60;
        auVar99 = local_360;
        local_3d0 = auVar71;
        local_3c0 = auVar73;
        local_3b0 = auVar74;
        if (bVar60 != 0) {
          uVar135 = vcmpps_avx512vl(auVar100,auVar92,4);
          bVar60 = bVar60 & (byte)uVar135;
          if (bVar60 != 0) {
            fVar160 = auVar89._0_4_ * fVar143;
            fVar162 = auVar89._4_4_ * fVar165;
            auVar32._4_4_ = fVar162;
            auVar32._0_4_ = fVar160;
            fVar61 = auVar89._8_4_ * fVar166;
            auVar32._8_4_ = fVar61;
            fVar62 = auVar89._12_4_ * fVar167;
            auVar32._12_4_ = fVar62;
            fVar122 = auVar89._16_4_ * 0.0;
            auVar32._16_4_ = fVar122;
            fVar123 = auVar89._20_4_ * 0.0;
            auVar32._20_4_ = fVar123;
            fVar124 = auVar89._24_4_ * 0.0;
            auVar32._24_4_ = fVar124;
            auVar32._28_4_ = auVar100._28_4_;
            auVar97 = vsubps_avx512vl(auVar98,auVar32);
            local_260._0_4_ =
                 (float)((uint)(bVar52 & 1) * (int)fVar160 |
                        (uint)!(bool)(bVar52 & 1) * auVar97._0_4_);
            bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar57 * (int)fVar162 | (uint)!bVar57 * auVar97._4_4_);
            bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar57 * (int)fVar61 | (uint)!bVar57 * auVar97._8_4_);
            bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar57 * (int)fVar62 | (uint)!bVar57 * auVar97._12_4_);
            bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
            local_260._16_4_ = (float)((uint)bVar57 * (int)fVar122 | (uint)!bVar57 * auVar97._16_4_)
            ;
            bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
            local_260._20_4_ = (float)((uint)bVar57 * (int)fVar123 | (uint)!bVar57 * auVar97._20_4_)
            ;
            bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
            local_260._24_4_ = (float)((uint)bVar57 * (int)fVar124 | (uint)!bVar57 * auVar97._24_4_)
            ;
            bVar57 = SUB81(uVar54 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar57 * auVar100._28_4_ | (uint)!bVar57 * auVar97._28_4_);
            auVar100 = vsubps_avx(ZEXT1632(auVar70),auVar93);
            auVar76 = vfmadd213ps_fma(auVar100,local_260,auVar93);
            fVar160 = local_530->depth_scale;
            auVar93._4_4_ = fVar160;
            auVar93._0_4_ = fVar160;
            auVar93._8_4_ = fVar160;
            auVar93._12_4_ = fVar160;
            auVar93._16_4_ = fVar160;
            auVar93._20_4_ = fVar160;
            auVar93._24_4_ = fVar160;
            auVar93._28_4_ = fVar160;
            auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                          CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                   CONCAT44(auVar76._4_4_ +
                                                                            auVar76._4_4_,
                                                                            auVar76._0_4_ +
                                                                            auVar76._0_4_)))),
                                       auVar93);
            uVar135 = vcmpps_avx512vl(local_220,auVar100,6);
            if (((byte)uVar135 & bVar60) != 0) {
              auVar150._0_4_ = auVar90._0_4_ * fVar143;
              auVar150._4_4_ = auVar90._4_4_ * fVar165;
              auVar150._8_4_ = auVar90._8_4_ * fVar166;
              auVar150._12_4_ = auVar90._12_4_ * fVar167;
              auVar150._16_4_ = auVar90._16_4_ * 0.0;
              auVar150._20_4_ = auVar90._20_4_ * 0.0;
              auVar150._24_4_ = auVar90._24_4_ * 0.0;
              auVar150._28_4_ = 0;
              auVar100 = vsubps_avx512vl(auVar98,auVar150);
              auVar110._0_4_ =
                   (uint)(bVar52 & 1) * (int)auVar150._0_4_ |
                   (uint)!(bool)(bVar52 & 1) * auVar100._0_4_;
              bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
              auVar110._4_4_ = (uint)bVar57 * (int)auVar150._4_4_ | (uint)!bVar57 * auVar100._4_4_;
              bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
              auVar110._8_4_ = (uint)bVar57 * (int)auVar150._8_4_ | (uint)!bVar57 * auVar100._8_4_;
              bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
              auVar110._12_4_ =
                   (uint)bVar57 * (int)auVar150._12_4_ | (uint)!bVar57 * auVar100._12_4_;
              bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
              auVar110._16_4_ =
                   (uint)bVar57 * (int)auVar150._16_4_ | (uint)!bVar57 * auVar100._16_4_;
              bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
              auVar110._20_4_ =
                   (uint)bVar57 * (int)auVar150._20_4_ | (uint)!bVar57 * auVar100._20_4_;
              bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
              auVar110._24_4_ =
                   (uint)bVar57 * (int)auVar150._24_4_ | (uint)!bVar57 * auVar100._24_4_;
              auVar110._28_4_ = (uint)!SUB81(uVar54 >> 7,0) * auVar100._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar110,auVar98,auVar24);
              local_200 = 0;
              local_1fc = iVar7;
              local_1f0 = local_3b0._0_8_;
              uStack_1e8 = local_3b0._8_8_;
              local_1e0 = local_3c0._0_8_;
              uStack_1d8 = local_3c0._8_8_;
              local_1d0 = local_3d0._0_8_;
              uStack_1c8 = local_3d0._8_8_;
              if ((pGVar8->mask & local_540->mask) != 0) {
                if ((local_558->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar57 = true, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_0191bc3a;
                auVar76 = vdivss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)local_2e0._0_4_));
                fVar160 = auVar76._0_4_;
                local_1a0[0] = fVar160 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar160 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar160 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar160 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar160 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar160 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar160 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                uVar54 = 0;
                uVar53 = (ulong)((byte)uVar135 & bVar60);
                for (uVar21 = uVar53; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
                {
                  uVar54 = uVar54 + 1;
                }
                local_3e0 = ZEXT416((uint)local_2a0);
                while( true ) {
                  local_2a0 = local_3e0._0_4_;
                  auVar76 = auVar186._0_16_;
                  auVar99 = local_360;
                  if (uVar53 == 0) break;
                  local_2a0 = (float)uVar53;
                  fStack_29c = (float)(uVar53 >> 0x20);
                  local_4b4 = local_1a0[uVar54];
                  local_4b0 = *(undefined4 *)(local_180 + uVar54 * 4);
                  local_2c0._0_4_ = local_540->tfar;
                  local_540->tfar = *(float *)(local_160 + uVar54 * 4);
                  local_4f0.context = local_558->user;
                  auVar81 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_4b4));
                  fVar143 = auVar81._0_4_;
                  fVar160 = fVar143 * fVar143 * -3.0;
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * fVar143)),
                                            ZEXT416((uint)(local_4b4 * fVar143)),ZEXT416(0xc0000000)
                                           );
                  auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_4b4 * fVar143)),
                                            ZEXT416((uint)(local_4b4 * local_4b4)),
                                            ZEXT416(0x40000000));
                  fVar143 = auVar81._0_4_ * 3.0;
                  fVar165 = auVar82._0_4_ * 3.0;
                  fVar166 = local_4b4 * local_4b4 * 3.0;
                  auVar158._0_4_ = fVar166 * (float)local_2f0._0_4_;
                  auVar158._4_4_ = fVar166 * (float)local_2f0._4_4_;
                  auVar158._8_4_ = fVar166 * fStack_2e8;
                  auVar158._12_4_ = fVar166 * fStack_2e4;
                  auVar144._4_4_ = fVar165;
                  auVar144._0_4_ = fVar165;
                  auVar144._8_4_ = fVar165;
                  auVar144._12_4_ = fVar165;
                  auVar81 = vfmadd132ps_fma(auVar144,auVar158,local_3d0);
                  auVar148._4_4_ = fVar143;
                  auVar148._0_4_ = fVar143;
                  auVar148._8_4_ = fVar143;
                  auVar148._12_4_ = fVar143;
                  auVar81 = vfmadd132ps_fma(auVar148,auVar81,local_3c0);
                  auVar145._4_4_ = fVar160;
                  auVar145._0_4_ = fVar160;
                  auVar145._8_4_ = fVar160;
                  auVar145._12_4_ = fVar160;
                  auVar81 = vfmadd132ps_fma(auVar145,auVar81,local_3b0);
                  local_4c0 = vmovlps_avx(auVar81);
                  local_4b8 = vextractps_avx(auVar81,2);
                  local_4ac = (int)local_488;
                  local_4a8 = (int)local_538;
                  local_4a4 = (local_4f0.context)->instID[0];
                  local_4a0 = (local_4f0.context)->instPrimID[0];
                  local_55c = -1;
                  local_4f0.valid = &local_55c;
                  local_4f0.geometryUserPtr = pGVar8->userPtr;
                  local_4f0.ray = (RTCRayN *)local_540;
                  local_4f0.hit = (RTCHitN *)&local_4c0;
                  local_4f0.N = 1;
                  if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar8->occlusionFilterN)(&local_4f0), *local_4f0.valid != 0)) {
                    p_Var12 = local_558->args->filter;
                    if ((p_Var12 == (RTCFilterFunctionN)0x0) ||
                       ((((local_558->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar8->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var12)(&local_4f0), *local_4f0.valid != 0)))) {
                      bVar57 = true;
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar185 = ZEXT3264(auVar99);
                      auVar76 = vxorps_avx512vl(auVar76,auVar76);
                      auVar186 = ZEXT1664(auVar76);
                      auVar187 = ZEXT3264(local_340);
                      auVar188 = ZEXT3264(local_320);
                      auVar184 = ZEXT3264(local_520);
                      auVar190 = ZEXT3264(local_480);
                      auVar192 = ZEXT3264(local_400);
                      auVar191 = ZEXT3264(local_420);
                      auVar183 = ZEXT3264(local_460);
                      auVar189 = ZEXT3264(local_440);
                      local_2a0 = local_3e0._0_4_;
                      auVar99 = local_360;
                      goto LAB_0191bc3a;
                    }
                  }
                  local_540->tfar = (float)local_2c0._0_4_;
                  uVar21 = uVar54 & 0x3f;
                  uVar54 = 0;
                  uVar53 = CONCAT44(fStack_29c,local_2a0) ^ 1L << uVar21;
                  for (uVar21 = uVar53; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                      ) {
                    uVar54 = uVar54 + 1;
                  }
                  auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar185 = ZEXT3264(auVar99);
                  auVar76 = vxorps_avx512vl(auVar76,auVar76);
                  auVar186 = ZEXT1664(auVar76);
                  auVar187 = ZEXT3264(local_340);
                  auVar188 = ZEXT3264(local_320);
                  auVar184 = ZEXT3264(local_520);
                  auVar190 = ZEXT3264(local_480);
                  auVar192 = ZEXT3264(local_400);
                  auVar191 = ZEXT3264(local_420);
                  auVar99 = vmovdqa64_avx512vl(local_460);
                  auVar183 = ZEXT3264(auVar99);
                  auVar189 = ZEXT3264(local_440);
                }
              }
            }
          }
        }
        bVar57 = false;
      }
    }
LAB_0191bc3a:
    context = local_558;
    ray = local_540;
    if (8 < iVar7) {
      local_360 = vpbroadcastd_avx512vl();
      fStack_29c = local_2a0;
      fStack_298 = local_2a0;
      fStack_294 = local_2a0;
      fStack_290 = local_2a0;
      fStack_28c = local_2a0;
      fStack_288 = local_2a0;
      fStack_284 = local_2a0;
      auVar134._8_4_ = 3;
      auVar134._0_8_ = 0x300000003;
      auVar134._12_4_ = 3;
      auVar134._16_4_ = 3;
      auVar134._20_4_ = 3;
      auVar134._24_4_ = 3;
      auVar134._28_4_ = 3;
      local_2c0 = vpermps_avx512vl(auVar134,auVar99);
      auVar76 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_2e0._0_4_));
      local_2e0._4_4_ = auVar76._0_4_;
      local_2e0._0_4_ = local_2e0._4_4_;
      fStack_2d8 = (float)local_2e0._4_4_;
      fStack_2d4 = (float)local_2e0._4_4_;
      fStack_2d0 = (float)local_2e0._4_4_;
      fStack_2cc = (float)local_2e0._4_4_;
      fStack_2c8 = (float)local_2e0._4_4_;
      fStack_2c4 = (float)local_2e0._4_4_;
      lVar59 = 8;
      local_480 = auVar190._0_32_;
      local_460 = auVar183._0_32_;
      uVar54 = local_538;
LAB_0191bcde:
      if (lVar59 < local_550) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar85 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar85,local_360,1);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 * 4 + lVar56);
        auVar100 = *(undefined1 (*) [32])(lVar56 + 0x21fb768 + lVar59 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar56 + 0x21fbbec + lVar59 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar56 + 0x21fc070 + lVar59 * 4);
        auVar101 = auVar183._0_32_;
        auVar86 = vmulps_avx512vl(auVar101,auVar97);
        auVar104 = auVar189._0_32_;
        auVar87 = vmulps_avx512vl(auVar104,auVar97);
        auVar33._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
        auVar33._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
        auVar33._8_4_ = auVar97._8_4_ * fStack_d8;
        auVar33._12_4_ = auVar97._12_4_ * fStack_d4;
        auVar33._16_4_ = auVar97._16_4_ * fStack_d0;
        auVar33._20_4_ = auVar97._20_4_ * fStack_cc;
        auVar33._24_4_ = auVar97._24_4_ * fStack_c8;
        auVar33._28_4_ = auVar85._28_4_;
        auVar107 = auVar192._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar86,auVar98,auVar107);
        auVar106 = auVar191._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar87,auVar98,auVar106);
        auVar87 = vfmadd231ps_avx512vl(auVar33,auVar98,local_c0);
        auVar102 = auVar184._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar102);
        auVar105 = auVar190._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar105);
        auVar76 = vfmadd231ps_fma(auVar87,auVar100,local_a0);
        auVar103 = auVar187._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar103);
        local_320 = auVar188._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar86,auVar99,local_320);
        auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 * 4 + lVar56);
        auVar86 = *(undefined1 (*) [32])(lVar56 + 0x21fdb88 + lVar59 * 4);
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar99,local_80);
        auVar87 = *(undefined1 (*) [32])(lVar56 + 0x21fe00c + lVar59 * 4);
        auVar96 = *(undefined1 (*) [32])(lVar56 + 0x21fe490 + lVar59 * 4);
        auVar88 = vmulps_avx512vl(auVar101,auVar96);
        auVar89 = vmulps_avx512vl(auVar104,auVar96);
        auVar34._4_4_ = auVar96._4_4_ * (float)local_e0._4_4_;
        auVar34._0_4_ = auVar96._0_4_ * (float)local_e0._0_4_;
        auVar34._8_4_ = auVar96._8_4_ * fStack_d8;
        auVar34._12_4_ = auVar96._12_4_ * fStack_d4;
        auVar34._16_4_ = auVar96._16_4_ * fStack_d0;
        auVar34._20_4_ = auVar96._20_4_ * fStack_cc;
        auVar34._24_4_ = auVar96._24_4_ * fStack_c8;
        auVar34._28_4_ = uStack_c4;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar107);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar106);
        auVar92 = vfmadd231ps_avx512vl(auVar34,auVar87,local_c0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar102);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar105);
        auVar81 = vfmadd231ps_fma(auVar92,auVar86,local_a0);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar85,auVar103);
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar85,local_320);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar85,local_80);
        auVar94 = vmaxps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar81));
        auVar88 = vsubps_avx(auVar92,auVar90);
        auVar89 = vsubps_avx(auVar93,auVar91);
        auVar95 = vmulps_avx512vl(auVar91,auVar88);
        auVar111 = vmulps_avx512vl(auVar90,auVar89);
        auVar95 = vsubps_avx512vl(auVar95,auVar111);
        auVar111 = vmulps_avx512vl(auVar89,auVar89);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar88,auVar88);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar94,auVar111);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar135 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar60 = (byte)uVar20 & (byte)uVar135;
        if (bVar60 == 0) {
          auVar184 = ZEXT3264(auVar102);
          auVar191 = ZEXT3264(auVar106);
          auVar183 = ZEXT3264(auVar101);
          goto LAB_0191c609;
        }
        auVar96 = vmulps_avx512vl(local_3a0,auVar96);
        auVar87 = vfmadd213ps_avx512vl(auVar87,local_140,auVar96);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar87);
        auVar85 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
        auVar97 = vmulps_avx512vl(local_3a0,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar98);
        auVar86 = vfmadd213ps_avx512vl(auVar99,local_100,auVar100);
        auVar99 = *(undefined1 (*) [32])(lVar56 + 0x21fc4f4 + lVar59 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar56 + 0x21fc978 + lVar59 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar56 + 0x21fcdfc + lVar59 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar56 + 0x21fd280 + lVar59 * 4);
        auVar87 = vmulps_avx512vl(auVar101,auVar97);
        auVar96 = vmulps_avx512vl(auVar104,auVar97);
        auVar97 = vmulps_avx512vl(local_3a0,auVar97);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar98,auVar107);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar106);
        auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar87,auVar100,auVar102);
        auVar87 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar105);
        auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar103);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
        auVar99 = *(undefined1 (*) [32])(lVar56 + 0x21fe914 + lVar59 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar56 + 0x21ff21c + lVar59 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar56 + 0x21ff6a0 + lVar59 * 4);
        auVar94 = vmulps_avx512vl(auVar101,auVar98);
        auVar95 = vmulps_avx512vl(auVar104,auVar98);
        auVar98 = vmulps_avx512vl(local_3a0,auVar98);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar107);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar106);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
        auVar100 = *(undefined1 (*) [32])(lVar56 + 0x21fed98 + lVar59 * 4);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar102);
        auVar82 = vfmadd231ps_fma(auVar95,auVar100,local_480);
        auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar103);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar99,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar97,auVar95);
        vandps_avx512vl(auVar87,auVar95);
        auVar99 = vmaxps_avx(auVar95,auVar95);
        vandps_avx512vl(auVar96,auVar95);
        auVar99 = vmaxps_avx(auVar99,auVar95);
        auVar51._4_4_ = fStack_29c;
        auVar51._0_4_ = local_2a0;
        auVar51._8_4_ = fStack_298;
        auVar51._12_4_ = fStack_294;
        auVar51._16_4_ = fStack_290;
        auVar51._20_4_ = fStack_28c;
        auVar51._24_4_ = fStack_288;
        auVar51._28_4_ = fStack_284;
        uVar21 = vcmpps_avx512vl(auVar99,auVar51,1);
        bVar13 = (bool)((byte)uVar21 & 1);
        auVar112._0_4_ = (float)((uint)bVar13 * auVar88._0_4_ | (uint)!bVar13 * auVar97._0_4_);
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar97._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar97._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar97._12_4_);
        bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar13 * auVar88._16_4_ | (uint)!bVar13 * auVar97._16_4_);
        bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar13 * auVar88._20_4_ | (uint)!bVar13 * auVar97._20_4_);
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar13 * auVar88._24_4_ | (uint)!bVar13 * auVar97._24_4_);
        bVar13 = SUB81(uVar21 >> 7,0);
        auVar112._28_4_ = (uint)bVar13 * auVar88._28_4_ | (uint)!bVar13 * auVar97._28_4_;
        bVar13 = (bool)((byte)uVar21 & 1);
        auVar113._0_4_ = (float)((uint)bVar13 * auVar89._0_4_ | (uint)!bVar13 * auVar87._0_4_);
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar87._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar87._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar87._12_4_);
        bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar87._16_4_);
        bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar87._20_4_);
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar87._24_4_);
        bVar13 = SUB81(uVar21 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar87._28_4_;
        vandps_avx512vl(auVar98,auVar95);
        vandps_avx512vl(auVar94,auVar95);
        auVar99 = vmaxps_avx(auVar113,auVar113);
        vandps_avx512vl(auVar100,auVar95);
        auVar99 = vmaxps_avx(auVar99,auVar113);
        uVar21 = vcmpps_avx512vl(auVar99,auVar51,1);
        bVar13 = (bool)((byte)uVar21 & 1);
        auVar114._0_4_ = (uint)bVar13 * auVar88._0_4_ | (uint)!bVar13 * auVar98._0_4_;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar98._4_4_;
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar98._8_4_;
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar98._12_4_;
        bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar114._16_4_ = (uint)bVar13 * auVar88._16_4_ | (uint)!bVar13 * auVar98._16_4_;
        bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar114._20_4_ = (uint)bVar13 * auVar88._20_4_ | (uint)!bVar13 * auVar98._20_4_;
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar114._24_4_ = (uint)bVar13 * auVar88._24_4_ | (uint)!bVar13 * auVar98._24_4_;
        bVar13 = SUB81(uVar21 >> 7,0);
        auVar114._28_4_ = (uint)bVar13 * auVar88._28_4_ | (uint)!bVar13 * auVar98._28_4_;
        bVar13 = (bool)((byte)uVar21 & 1);
        auVar115._0_4_ = (float)((uint)bVar13 * auVar89._0_4_ | (uint)!bVar13 * auVar94._0_4_);
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar94._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar94._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar94._12_4_);
        bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar94._16_4_);
        bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar94._20_4_);
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar94._24_4_);
        bVar13 = SUB81(uVar21 >> 7,0);
        auVar115._28_4_ = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar94._28_4_;
        auVar170._8_4_ = 0x80000000;
        auVar170._0_8_ = 0x8000000080000000;
        auVar170._12_4_ = 0x80000000;
        auVar170._16_4_ = 0x80000000;
        auVar170._20_4_ = 0x80000000;
        auVar170._24_4_ = 0x80000000;
        auVar170._28_4_ = 0x80000000;
        auVar99 = vxorps_avx512vl(auVar114,auVar170);
        auVar94 = auVar186._0_32_;
        auVar100 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar94);
        auVar82 = vfmadd231ps_fma(auVar100,auVar113,auVar113);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        auVar182._8_4_ = 0xbf000000;
        auVar182._0_8_ = 0xbf000000bf000000;
        auVar182._12_4_ = 0xbf000000;
        auVar182._16_4_ = 0xbf000000;
        auVar182._20_4_ = 0xbf000000;
        auVar182._24_4_ = 0xbf000000;
        auVar182._28_4_ = 0xbf000000;
        fVar160 = auVar100._0_4_;
        fVar143 = auVar100._4_4_;
        fVar165 = auVar100._8_4_;
        fVar166 = auVar100._12_4_;
        fVar167 = auVar100._16_4_;
        fVar162 = auVar100._20_4_;
        fVar61 = auVar100._24_4_;
        auVar35._4_4_ = fVar143 * fVar143 * fVar143 * auVar82._4_4_ * -0.5;
        auVar35._0_4_ = fVar160 * fVar160 * fVar160 * auVar82._0_4_ * -0.5;
        auVar35._8_4_ = fVar165 * fVar165 * fVar165 * auVar82._8_4_ * -0.5;
        auVar35._12_4_ = fVar166 * fVar166 * fVar166 * auVar82._12_4_ * -0.5;
        auVar35._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar35._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar35._24_4_ = fVar61 * fVar61 * fVar61 * -0.0;
        auVar35._28_4_ = auVar113._28_4_;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar100 = vfmadd231ps_avx512vl(auVar35,auVar98,auVar100);
        auVar36._4_4_ = auVar113._4_4_ * auVar100._4_4_;
        auVar36._0_4_ = auVar113._0_4_ * auVar100._0_4_;
        auVar36._8_4_ = auVar113._8_4_ * auVar100._8_4_;
        auVar36._12_4_ = auVar113._12_4_ * auVar100._12_4_;
        auVar36._16_4_ = auVar113._16_4_ * auVar100._16_4_;
        auVar36._20_4_ = auVar113._20_4_ * auVar100._20_4_;
        auVar36._24_4_ = auVar113._24_4_ * auVar100._24_4_;
        auVar36._28_4_ = 0;
        auVar37._4_4_ = auVar100._4_4_ * -auVar112._4_4_;
        auVar37._0_4_ = auVar100._0_4_ * -auVar112._0_4_;
        auVar37._8_4_ = auVar100._8_4_ * -auVar112._8_4_;
        auVar37._12_4_ = auVar100._12_4_ * -auVar112._12_4_;
        auVar37._16_4_ = auVar100._16_4_ * -auVar112._16_4_;
        auVar37._20_4_ = auVar100._20_4_ * -auVar112._20_4_;
        auVar37._24_4_ = auVar100._24_4_ * -auVar112._24_4_;
        auVar37._28_4_ = auVar113._28_4_;
        auVar97 = vmulps_avx512vl(auVar100,auVar94);
        auVar100 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar94);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,auVar115);
        auVar87 = vrsqrt14ps_avx512vl(auVar100);
        auVar100 = vmulps_avx512vl(auVar100,auVar182);
        fVar160 = auVar87._0_4_;
        fVar143 = auVar87._4_4_;
        fVar165 = auVar87._8_4_;
        fVar166 = auVar87._12_4_;
        fVar167 = auVar87._16_4_;
        fVar162 = auVar87._20_4_;
        fVar61 = auVar87._24_4_;
        auVar38._4_4_ = fVar143 * fVar143 * fVar143 * auVar100._4_4_;
        auVar38._0_4_ = fVar160 * fVar160 * fVar160 * auVar100._0_4_;
        auVar38._8_4_ = fVar165 * fVar165 * fVar165 * auVar100._8_4_;
        auVar38._12_4_ = fVar166 * fVar166 * fVar166 * auVar100._12_4_;
        auVar38._16_4_ = fVar167 * fVar167 * fVar167 * auVar100._16_4_;
        auVar38._20_4_ = fVar162 * fVar162 * fVar162 * auVar100._20_4_;
        auVar38._24_4_ = fVar61 * fVar61 * fVar61 * auVar100._24_4_;
        auVar38._28_4_ = auVar100._28_4_;
        auVar100 = vfmadd231ps_avx512vl(auVar38,auVar98,auVar87);
        auVar39._4_4_ = auVar115._4_4_ * auVar100._4_4_;
        auVar39._0_4_ = auVar115._0_4_ * auVar100._0_4_;
        auVar39._8_4_ = auVar115._8_4_ * auVar100._8_4_;
        auVar39._12_4_ = auVar115._12_4_ * auVar100._12_4_;
        auVar39._16_4_ = auVar115._16_4_ * auVar100._16_4_;
        auVar39._20_4_ = auVar115._20_4_ * auVar100._20_4_;
        auVar39._24_4_ = auVar115._24_4_ * auVar100._24_4_;
        auVar39._28_4_ = auVar87._28_4_;
        auVar40._4_4_ = auVar100._4_4_ * auVar99._4_4_;
        auVar40._0_4_ = auVar100._0_4_ * auVar99._0_4_;
        auVar40._8_4_ = auVar100._8_4_ * auVar99._8_4_;
        auVar40._12_4_ = auVar100._12_4_ * auVar99._12_4_;
        auVar40._16_4_ = auVar100._16_4_ * auVar99._16_4_;
        auVar40._20_4_ = auVar100._20_4_ * auVar99._20_4_;
        auVar40._24_4_ = auVar100._24_4_ * auVar99._24_4_;
        auVar40._28_4_ = auVar99._28_4_;
        auVar99 = vmulps_avx512vl(auVar100,auVar94);
        auVar82 = vfmadd213ps_fma(auVar36,ZEXT1632(auVar76),auVar90);
        auVar100 = ZEXT1632(auVar76);
        auVar77 = vfmadd213ps_fma(auVar37,auVar100,auVar91);
        auVar98 = vfmadd213ps_avx512vl(auVar97,auVar100,auVar86);
        auVar87 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar81),auVar92);
        auVar69 = vfnmadd213ps_fma(auVar36,auVar100,auVar90);
        auVar96 = ZEXT1632(auVar81);
        auVar6 = vfmadd213ps_fma(auVar40,auVar96,auVar93);
        auVar70 = vfnmadd213ps_fma(auVar37,auVar100,auVar91);
        auVar19 = vfmadd213ps_fma(auVar99,auVar96,auVar85);
        auVar91 = ZEXT1632(auVar76);
        auVar74 = vfnmadd231ps_fma(auVar86,auVar91,auVar97);
        auVar71 = vfnmadd213ps_fma(auVar39,auVar96,auVar92);
        auVar73 = vfnmadd213ps_fma(auVar40,auVar96,auVar93);
        auVar75 = vfnmadd231ps_fma(auVar85,ZEXT1632(auVar81),auVar99);
        auVar85 = vsubps_avx512vl(auVar87,ZEXT1632(auVar69));
        auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar70));
        auVar100 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar74));
        auVar41._4_4_ = auVar99._4_4_ * auVar74._4_4_;
        auVar41._0_4_ = auVar99._0_4_ * auVar74._0_4_;
        auVar41._8_4_ = auVar99._8_4_ * auVar74._8_4_;
        auVar41._12_4_ = auVar99._12_4_ * auVar74._12_4_;
        auVar41._16_4_ = auVar99._16_4_ * 0.0;
        auVar41._20_4_ = auVar99._20_4_ * 0.0;
        auVar41._24_4_ = auVar99._24_4_ * 0.0;
        auVar41._28_4_ = auVar97._28_4_;
        auVar76 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar70),auVar100);
        auVar42._4_4_ = auVar100._4_4_ * auVar69._4_4_;
        auVar42._0_4_ = auVar100._0_4_ * auVar69._0_4_;
        auVar42._8_4_ = auVar100._8_4_ * auVar69._8_4_;
        auVar42._12_4_ = auVar100._12_4_ * auVar69._12_4_;
        auVar42._16_4_ = auVar100._16_4_ * 0.0;
        auVar42._20_4_ = auVar100._20_4_ * 0.0;
        auVar42._24_4_ = auVar100._24_4_ * 0.0;
        auVar42._28_4_ = auVar100._28_4_;
        auVar72 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar74),auVar85);
        auVar43._4_4_ = auVar70._4_4_ * auVar85._4_4_;
        auVar43._0_4_ = auVar70._0_4_ * auVar85._0_4_;
        auVar43._8_4_ = auVar70._8_4_ * auVar85._8_4_;
        auVar43._12_4_ = auVar70._12_4_ * auVar85._12_4_;
        auVar43._16_4_ = auVar85._16_4_ * 0.0;
        auVar43._20_4_ = auVar85._20_4_ * 0.0;
        auVar43._24_4_ = auVar85._24_4_ * 0.0;
        auVar43._28_4_ = auVar85._28_4_;
        auVar68 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar69),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar94,ZEXT1632(auVar72));
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar76));
        uVar21 = vcmpps_avx512vl(auVar99,auVar94,2);
        bVar52 = (byte)uVar21;
        fVar123 = (float)((uint)(bVar52 & 1) * auVar82._0_4_ |
                         (uint)!(bool)(bVar52 & 1) * auVar71._0_4_);
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        fVar125 = (float)((uint)bVar13 * auVar82._4_4_ | (uint)!bVar13 * auVar71._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        fVar128 = (float)((uint)bVar13 * auVar82._8_4_ | (uint)!bVar13 * auVar71._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        fVar129 = (float)((uint)bVar13 * auVar82._12_4_ | (uint)!bVar13 * auVar71._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar128,CONCAT44(fVar125,fVar123))));
        fVar124 = (float)((uint)(bVar52 & 1) * auVar77._0_4_ |
                         (uint)!(bool)(bVar52 & 1) * auVar73._0_4_);
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        fVar127 = (float)((uint)bVar13 * auVar77._4_4_ | (uint)!bVar13 * auVar73._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        fVar126 = (float)((uint)bVar13 * auVar77._8_4_ | (uint)!bVar13 * auVar73._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        fVar130 = (float)((uint)bVar13 * auVar77._12_4_ | (uint)!bVar13 * auVar73._12_4_);
        auVar88 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar126,CONCAT44(fVar127,fVar124))));
        auVar116._0_4_ =
             (float)((uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar75._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar75._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar75._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar75._12_4_);
        fVar160 = (float)((uint)((byte)(uVar21 >> 4) & 1) * auVar98._16_4_);
        auVar116._16_4_ = fVar160;
        fVar143 = (float)((uint)((byte)(uVar21 >> 5) & 1) * auVar98._20_4_);
        auVar116._20_4_ = fVar143;
        fVar165 = (float)((uint)((byte)(uVar21 >> 6) & 1) * auVar98._24_4_);
        auVar116._24_4_ = fVar165;
        iVar1 = (uint)(byte)(uVar21 >> 7) * auVar98._28_4_;
        auVar116._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar69),auVar87);
        auVar117._0_4_ =
             (uint)(bVar52 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar76._0_4_;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar76._4_4_;
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar76._8_4_;
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar76._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar99._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar99._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar99._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar6));
        auVar118._0_4_ =
             (float)((uint)(bVar52 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar82._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar82._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar82._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar82._12_4_);
        fVar162 = (float)((uint)((byte)(uVar21 >> 4) & 1) * auVar99._16_4_);
        auVar118._16_4_ = fVar162;
        fVar166 = (float)((uint)((byte)(uVar21 >> 5) & 1) * auVar99._20_4_);
        auVar118._20_4_ = fVar166;
        fVar167 = (float)((uint)((byte)(uVar21 >> 6) & 1) * auVar99._24_4_);
        auVar118._24_4_ = fVar167;
        auVar118._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar19));
        auVar119._0_4_ =
             (float)((uint)(bVar52 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar77._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar77._4_4_);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar77._8_4_);
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar77._12_4_);
        fVar61 = (float)((uint)((byte)(uVar21 >> 4) & 1) * auVar99._16_4_);
        auVar119._16_4_ = fVar61;
        fVar62 = (float)((uint)((byte)(uVar21 >> 5) & 1) * auVar99._20_4_);
        auVar119._20_4_ = fVar62;
        fVar122 = (float)((uint)((byte)(uVar21 >> 6) & 1) * auVar99._24_4_);
        auVar119._24_4_ = fVar122;
        iVar2 = (uint)(byte)(uVar21 >> 7) * auVar99._28_4_;
        auVar119._28_4_ = iVar2;
        auVar120._0_4_ =
             (uint)(bVar52 & 1) * (int)auVar69._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar87._0_4_;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar13 * (int)auVar69._4_4_ | (uint)!bVar13 * auVar87._4_4_;
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar13 * (int)auVar69._8_4_ | (uint)!bVar13 * auVar87._8_4_;
        bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar13 * (int)auVar69._12_4_ | (uint)!bVar13 * auVar87._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar21 >> 4) & 1) * auVar87._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar21 >> 5) & 1) * auVar87._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar21 >> 6) & 1) * auVar87._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar21 >> 7,0) * auVar87._28_4_;
        bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar87 = vsubps_avx512vl(auVar120,auVar96);
        auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar70._12_4_ |
                                                 (uint)!bVar17 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar70._8_4_ |
                                                          (uint)!bVar16 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar70._4_4_
                                                                   | (uint)!bVar13 * auVar6._4_4_,
                                                                   (uint)(bVar52 & 1) *
                                                                   (int)auVar70._0_4_ |
                                                                   (uint)!(bool)(bVar52 & 1) *
                                                                   auVar6._0_4_)))),auVar88);
        auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar74._12_4_ |
                                                (uint)!bVar18 * auVar19._12_4_,
                                                CONCAT48((uint)bVar15 * (int)auVar74._8_4_ |
                                                         (uint)!bVar15 * auVar19._8_4_,
                                                         CONCAT44((uint)bVar14 * (int)auVar74._4_4_
                                                                  | (uint)!bVar14 * auVar19._4_4_,
                                                                  (uint)(bVar52 & 1) *
                                                                  (int)auVar74._0_4_ |
                                                                  (uint)!(bool)(bVar52 & 1) *
                                                                  auVar19._0_4_)))),auVar116);
        auVar97 = vsubps_avx(auVar96,auVar117);
        auVar85 = vsubps_avx(auVar88,auVar118);
        auVar86 = vsubps_avx(auVar116,auVar119);
        auVar44._4_4_ = auVar98._4_4_ * fVar125;
        auVar44._0_4_ = auVar98._0_4_ * fVar123;
        auVar44._8_4_ = auVar98._8_4_ * fVar128;
        auVar44._12_4_ = auVar98._12_4_ * fVar129;
        auVar44._16_4_ = auVar98._16_4_ * 0.0;
        auVar44._20_4_ = auVar98._20_4_ * 0.0;
        auVar44._24_4_ = auVar98._24_4_ * 0.0;
        auVar44._28_4_ = 0;
        auVar76 = vfmsub231ps_fma(auVar44,auVar116,auVar87);
        auVar151._0_4_ = fVar124 * auVar87._0_4_;
        auVar151._4_4_ = fVar127 * auVar87._4_4_;
        auVar151._8_4_ = fVar126 * auVar87._8_4_;
        auVar151._12_4_ = fVar130 * auVar87._12_4_;
        auVar151._16_4_ = auVar87._16_4_ * 0.0;
        auVar151._20_4_ = auVar87._20_4_ * 0.0;
        auVar151._24_4_ = auVar87._24_4_ * 0.0;
        auVar151._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar151,auVar96,auVar100);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar94,ZEXT1632(auVar76));
        auVar154._0_4_ = auVar100._0_4_ * auVar116._0_4_;
        auVar154._4_4_ = auVar100._4_4_ * auVar116._4_4_;
        auVar154._8_4_ = auVar100._8_4_ * auVar116._8_4_;
        auVar154._12_4_ = auVar100._12_4_ * auVar116._12_4_;
        auVar154._16_4_ = auVar100._16_4_ * fVar160;
        auVar154._20_4_ = auVar100._20_4_ * fVar143;
        auVar154._24_4_ = auVar100._24_4_ * fVar165;
        auVar154._28_4_ = 0;
        auVar76 = vfmsub231ps_fma(auVar154,auVar88,auVar98);
        auVar89 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar76));
        auVar99 = vmulps_avx512vl(auVar86,auVar117);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar119);
        auVar45._4_4_ = auVar85._4_4_ * auVar119._4_4_;
        auVar45._0_4_ = auVar85._0_4_ * auVar119._0_4_;
        auVar45._8_4_ = auVar85._8_4_ * auVar119._8_4_;
        auVar45._12_4_ = auVar85._12_4_ * auVar119._12_4_;
        auVar45._16_4_ = auVar85._16_4_ * fVar61;
        auVar45._20_4_ = auVar85._20_4_ * fVar62;
        auVar45._24_4_ = auVar85._24_4_ * fVar122;
        auVar45._28_4_ = iVar2;
        auVar76 = vfmsub231ps_fma(auVar45,auVar118,auVar86);
        auVar155._0_4_ = auVar118._0_4_ * auVar97._0_4_;
        auVar155._4_4_ = auVar118._4_4_ * auVar97._4_4_;
        auVar155._8_4_ = auVar118._8_4_ * auVar97._8_4_;
        auVar155._12_4_ = auVar118._12_4_ * auVar97._12_4_;
        auVar155._16_4_ = fVar162 * auVar97._16_4_;
        auVar155._20_4_ = fVar166 * auVar97._20_4_;
        auVar155._24_4_ = fVar167 * auVar97._24_4_;
        auVar155._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar155,auVar85,auVar117);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar94,auVar99);
        auVar90 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar76));
        auVar99 = vmaxps_avx(auVar89,auVar90);
        uVar135 = vcmpps_avx512vl(auVar99,auVar94,2);
        bVar60 = bVar60 & (byte)uVar135;
        if (bVar60 != 0) {
          auVar46._4_4_ = auVar86._4_4_ * auVar100._4_4_;
          auVar46._0_4_ = auVar86._0_4_ * auVar100._0_4_;
          auVar46._8_4_ = auVar86._8_4_ * auVar100._8_4_;
          auVar46._12_4_ = auVar86._12_4_ * auVar100._12_4_;
          auVar46._16_4_ = auVar86._16_4_ * auVar100._16_4_;
          auVar46._20_4_ = auVar86._20_4_ * auVar100._20_4_;
          auVar46._24_4_ = auVar86._24_4_ * auVar100._24_4_;
          auVar46._28_4_ = auVar99._28_4_;
          auVar77 = vfmsub231ps_fma(auVar46,auVar85,auVar98);
          auVar47._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar47._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar47._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar47._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar47._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar47._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar47._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar47._28_4_ = auVar98._28_4_;
          auVar82 = vfmsub231ps_fma(auVar47,auVar87,auVar86);
          auVar48._4_4_ = auVar85._4_4_ * auVar87._4_4_;
          auVar48._0_4_ = auVar85._0_4_ * auVar87._0_4_;
          auVar48._8_4_ = auVar85._8_4_ * auVar87._8_4_;
          auVar48._12_4_ = auVar85._12_4_ * auVar87._12_4_;
          auVar48._16_4_ = auVar85._16_4_ * auVar87._16_4_;
          auVar48._20_4_ = auVar85._20_4_ * auVar87._20_4_;
          auVar48._24_4_ = auVar85._24_4_ * auVar87._24_4_;
          auVar48._28_4_ = auVar85._28_4_;
          auVar6 = vfmsub231ps_fma(auVar48,auVar97,auVar100);
          auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar6));
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar77),auVar94);
          auVar100 = vrcp14ps_avx512vl(auVar99);
          auVar97 = auVar185._0_32_;
          auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar97);
          auVar76 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
          auVar49._4_4_ = auVar6._4_4_ * auVar116._4_4_;
          auVar49._0_4_ = auVar6._0_4_ * auVar116._0_4_;
          auVar49._8_4_ = auVar6._8_4_ * auVar116._8_4_;
          auVar49._12_4_ = auVar6._12_4_ * auVar116._12_4_;
          auVar49._16_4_ = fVar160 * 0.0;
          auVar49._20_4_ = fVar143 * 0.0;
          auVar49._24_4_ = fVar165 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar82 = vfmadd231ps_fma(auVar49,auVar88,ZEXT1632(auVar82));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar96,ZEXT1632(auVar77));
          fVar143 = auVar76._0_4_;
          fVar165 = auVar76._4_4_;
          fVar166 = auVar76._8_4_;
          fVar167 = auVar76._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar167,
                                         CONCAT48(auVar82._8_4_ * fVar166,
                                                  CONCAT44(auVar82._4_4_ * fVar165,
                                                           auVar82._0_4_ * fVar143))));
          uVar135 = vcmpps_avx512vl(local_220,local_2c0,0xd);
          fVar160 = ray->tfar;
          auVar25._4_4_ = fVar160;
          auVar25._0_4_ = fVar160;
          auVar25._8_4_ = fVar160;
          auVar25._12_4_ = fVar160;
          auVar25._16_4_ = fVar160;
          auVar25._20_4_ = fVar160;
          auVar25._24_4_ = fVar160;
          auVar25._28_4_ = fVar160;
          uVar20 = vcmpps_avx512vl(local_220,auVar25,2);
          bVar60 = (byte)uVar135 & (byte)uVar20 & bVar60;
          if (bVar60 == 0) goto LAB_0191c612;
          uVar135 = vcmpps_avx512vl(auVar99,auVar94,4);
          bVar60 = bVar60 & (byte)uVar135;
          auVar184 = ZEXT3264(local_520);
          auVar190 = ZEXT3264(local_480);
          auVar192 = ZEXT3264(local_400);
          auVar191 = ZEXT3264(local_420);
          auVar183 = ZEXT3264(local_460);
          auVar189 = ZEXT3264(local_440);
          if (bVar60 == 0) goto LAB_0191c609;
          fVar160 = auVar89._0_4_ * fVar143;
          fVar162 = auVar89._4_4_ * fVar165;
          auVar50._4_4_ = fVar162;
          auVar50._0_4_ = fVar160;
          fVar61 = auVar89._8_4_ * fVar166;
          auVar50._8_4_ = fVar61;
          fVar62 = auVar89._12_4_ * fVar167;
          auVar50._12_4_ = fVar62;
          fVar122 = auVar89._16_4_ * 0.0;
          auVar50._16_4_ = fVar122;
          fVar123 = auVar89._20_4_ * 0.0;
          auVar50._20_4_ = fVar123;
          fVar124 = auVar89._24_4_ * 0.0;
          auVar50._24_4_ = fVar124;
          auVar50._28_4_ = auVar99._28_4_;
          auVar100 = vsubps_avx512vl(auVar97,auVar50);
          local_260._0_4_ =
               (float)((uint)(bVar52 & 1) * (int)fVar160 |
                      (uint)!(bool)(bVar52 & 1) * auVar100._0_4_);
          bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
          local_260._4_4_ = (float)((uint)bVar13 * (int)fVar162 | (uint)!bVar13 * auVar100._4_4_);
          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
          local_260._8_4_ = (float)((uint)bVar13 * (int)fVar61 | (uint)!bVar13 * auVar100._8_4_);
          bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
          local_260._12_4_ = (float)((uint)bVar13 * (int)fVar62 | (uint)!bVar13 * auVar100._12_4_);
          bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
          local_260._16_4_ = (float)((uint)bVar13 * (int)fVar122 | (uint)!bVar13 * auVar100._16_4_);
          bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
          local_260._20_4_ = (float)((uint)bVar13 * (int)fVar123 | (uint)!bVar13 * auVar100._20_4_);
          bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
          local_260._24_4_ = (float)((uint)bVar13 * (int)fVar124 | (uint)!bVar13 * auVar100._24_4_);
          bVar13 = SUB81(uVar21 >> 7,0);
          local_260._28_4_ =
               (float)((uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar100._28_4_);
          auVar99 = vsubps_avx(ZEXT1632(auVar81),auVar91);
          auVar76 = vfmadd213ps_fma(auVar99,local_260,auVar91);
          fVar160 = local_530->depth_scale;
          auVar26._4_4_ = fVar160;
          auVar26._0_4_ = fVar160;
          auVar26._8_4_ = fVar160;
          auVar26._12_4_ = fVar160;
          auVar26._16_4_ = fVar160;
          auVar26._20_4_ = fVar160;
          auVar26._24_4_ = fVar160;
          auVar26._28_4_ = fVar160;
          auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                       CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                CONCAT44(auVar76._4_4_ +
                                                                         auVar76._4_4_,
                                                                         auVar76._0_4_ +
                                                                         auVar76._0_4_)))),auVar26);
          uVar135 = vcmpps_avx512vl(local_220,auVar99,6);
          if (((byte)uVar135 & bVar60) == 0) goto LAB_0191c609;
          auVar142._0_4_ = auVar90._0_4_ * fVar143;
          auVar142._4_4_ = auVar90._4_4_ * fVar165;
          auVar142._8_4_ = auVar90._8_4_ * fVar166;
          auVar142._12_4_ = auVar90._12_4_ * fVar167;
          auVar142._16_4_ = auVar90._16_4_ * 0.0;
          auVar142._20_4_ = auVar90._20_4_ * 0.0;
          auVar142._24_4_ = auVar90._24_4_ * 0.0;
          auVar142._28_4_ = 0;
          auVar99 = vsubps_avx512vl(auVar97,auVar142);
          auVar121._0_4_ =
               (uint)(bVar52 & 1) * (int)auVar142._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar99._0_4_;
          bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar13 * (int)auVar142._4_4_ | (uint)!bVar13 * auVar99._4_4_;
          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar13 * (int)auVar142._8_4_ | (uint)!bVar13 * auVar99._8_4_;
          bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar13 * (int)auVar142._12_4_ | (uint)!bVar13 * auVar99._12_4_;
          bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar13 * (int)auVar142._16_4_ | (uint)!bVar13 * auVar99._16_4_;
          bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar13 * (int)auVar142._20_4_ | (uint)!bVar13 * auVar99._20_4_;
          bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar13 * (int)auVar142._24_4_ | (uint)!bVar13 * auVar99._24_4_;
          auVar121._28_4_ = (uint)!SUB81(uVar21 >> 7,0) * auVar99._28_4_;
          auVar27._8_4_ = 0x40000000;
          auVar27._0_8_ = 0x4000000040000000;
          auVar27._12_4_ = 0x40000000;
          auVar27._16_4_ = 0x40000000;
          auVar27._20_4_ = 0x40000000;
          auVar27._24_4_ = 0x40000000;
          auVar27._28_4_ = 0x40000000;
          local_240 = vfmsub132ps_avx512vl(auVar121,auVar97,auVar27);
          local_200 = (int)lVar59;
          local_1fc = iVar7;
          local_1f0 = local_3b0._0_8_;
          uStack_1e8 = local_3b0._8_8_;
          local_1e0 = local_3c0._0_8_;
          uStack_1d8 = local_3c0._8_8_;
          local_1d0 = local_3d0._0_8_;
          uStack_1c8 = local_3d0._8_8_;
          pGVar8 = (context->scene->geometries).items[uVar54].ptr;
          if ((pGVar8->mask & ray->mask) == 0) {
            bVar52 = 0;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar52 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_490 = pGVar8;
            auVar76 = vcvtsi2ss_avx512f(auVar185._0_16_,(int)lVar59);
            fVar160 = auVar76._0_4_;
            local_1a0[0] = (fVar160 + local_260._0_4_ + 0.0) * (float)local_2e0._0_4_;
            local_1a0[1] = (fVar160 + local_260._4_4_ + 1.0) * (float)local_2e0._4_4_;
            local_1a0[2] = (fVar160 + local_260._8_4_ + 2.0) * fStack_2d8;
            local_1a0[3] = (fVar160 + local_260._12_4_ + 3.0) * fStack_2d4;
            fStack_190 = (fVar160 + local_260._16_4_ + 4.0) * fStack_2d0;
            fStack_18c = (fVar160 + local_260._20_4_ + 5.0) * fStack_2cc;
            fStack_188 = (fVar160 + local_260._24_4_ + 6.0) * fStack_2c8;
            fStack_184 = fVar160 + local_260._28_4_ + 7.0;
            local_180 = local_240;
            local_160 = local_220;
            uVar54 = (ulong)((byte)uVar135 & bVar60);
            do {
              uVar21 = 0;
              for (uVar53 = uVar54; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                uVar21 = uVar21 + 1;
              }
              local_3e0._0_8_ = uVar54;
              if (uVar54 == 0) {
                bVar52 = 0;
                auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar76 = vxorps_avx512vl(auVar186._0_16_,auVar186._0_16_);
                goto LAB_0191c6a4;
              }
              local_4b4 = local_1a0[uVar21];
              local_4b0 = *(undefined4 *)(local_180 + uVar21 * 4);
              local_524 = ray->tfar;
              local_368 = uVar21;
              ray->tfar = *(float *)(local_160 + uVar21 * 4);
              local_4f0.context = context->user;
              auVar76 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)local_4b4));
              fVar143 = auVar76._0_4_;
              fVar160 = fVar143 * fVar143 * -3.0;
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * fVar143)),
                                        ZEXT416((uint)(local_4b4 * fVar143)),ZEXT416(0xc0000000));
              auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4b4 * fVar143)),
                                        ZEXT416((uint)(local_4b4 * local_4b4)),ZEXT416(0x40000000));
              fVar143 = auVar76._0_4_ * 3.0;
              fVar165 = auVar81._0_4_ * 3.0;
              fVar166 = local_4b4 * local_4b4 * 3.0;
              auVar159._0_4_ = fVar166 * (float)local_2f0._0_4_;
              auVar159._4_4_ = fVar166 * (float)local_2f0._4_4_;
              auVar159._8_4_ = fVar166 * fStack_2e8;
              auVar159._12_4_ = fVar166 * fStack_2e4;
              auVar146._4_4_ = fVar165;
              auVar146._0_4_ = fVar165;
              auVar146._8_4_ = fVar165;
              auVar146._12_4_ = fVar165;
              auVar76 = vfmadd132ps_fma(auVar146,auVar159,local_3d0);
              auVar149._4_4_ = fVar143;
              auVar149._0_4_ = fVar143;
              auVar149._8_4_ = fVar143;
              auVar149._12_4_ = fVar143;
              auVar76 = vfmadd132ps_fma(auVar149,auVar76,local_3c0);
              auVar147._4_4_ = fVar160;
              auVar147._0_4_ = fVar160;
              auVar147._8_4_ = fVar160;
              auVar147._12_4_ = fVar160;
              auVar76 = vfmadd132ps_fma(auVar147,auVar76,local_3b0);
              local_4c0 = vmovlps_avx(auVar76);
              local_4b8 = vextractps_avx(auVar76,2);
              local_4ac = (int)local_488;
              local_4a8 = (int)local_538;
              local_4a4 = (local_4f0.context)->instID[0];
              local_4a0 = (local_4f0.context)->instPrimID[0];
              local_55c = -1;
              local_4f0.valid = &local_55c;
              local_4f0.geometryUserPtr = local_490->userPtr;
              local_4f0.ray = (RTCRayN *)ray;
              local_4f0.hit = (RTCHitN *)&local_4c0;
              local_4f0.N = 1;
              if ((local_490->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*local_490->occlusionFilterN)(&local_4f0), context = local_558,
                 *local_4f0.valid != 0)) {
                auVar76 = auVar186._0_16_;
                p_Var12 = context->args->filter;
                if ((p_Var12 == (RTCFilterFunctionN)0x0) ||
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                     RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_490->field_8).field_0x2 & 0x40) == 0)
                    ))) goto LAB_0191c644;
                (*p_Var12)(&local_4f0);
                auVar76 = auVar186._0_16_;
                context = local_558;
                if (*local_4f0.valid != 0) goto LAB_0191c644;
              }
              local_540->tfar = local_524;
              uVar54 = local_3e0._0_8_ ^ 1L << (local_368 & 0x3f);
              context = local_558;
              ray = local_540;
            } while( true );
          }
          goto LAB_0191c606;
        }
LAB_0191c612:
        auVar184 = ZEXT3264(local_520);
        auVar190 = ZEXT3264(local_480);
        auVar192 = ZEXT3264(local_400);
        auVar191 = ZEXT3264(local_420);
        auVar183 = ZEXT3264(local_460);
        auVar189 = ZEXT3264(local_440);
        goto LAB_0191c609;
      }
    }
    if (bVar57) break;
    fVar160 = ray->tfar;
    auVar22._4_4_ = fVar160;
    auVar22._0_4_ = fVar160;
    auVar22._8_4_ = fVar160;
    auVar22._12_4_ = fVar160;
    uVar135 = vcmpps_avx512vl(local_270,auVar22,2);
  }
  return uVar58 != 0;
LAB_0191c644:
  bVar52 = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar76 = vxorps_avx512vl(auVar76,auVar76);
  ray = local_540;
LAB_0191c6a4:
  auVar186 = ZEXT1664(auVar76);
  auVar185 = ZEXT3264(auVar99);
  auVar187 = ZEXT3264(local_340);
  auVar188 = ZEXT3264(local_320);
  auVar184 = ZEXT3264(local_520);
  auVar190 = ZEXT3264(local_480);
  auVar192 = ZEXT3264(local_400);
  auVar191 = ZEXT3264(local_420);
  auVar183 = ZEXT3264(local_460);
  auVar189 = ZEXT3264(local_440);
  uVar54 = local_538;
LAB_0191c606:
  bVar57 = (bool)(bVar57 | bVar52);
LAB_0191c609:
  lVar59 = lVar59 + 8;
  goto LAB_0191bcde;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }